

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  undefined8 uVar6;
  ulong uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar64;
  uint uVar65;
  ulong uVar66;
  uint uVar67;
  long lVar68;
  ulong uVar69;
  byte bVar71;
  uint uVar72;
  undefined4 uVar73;
  long lVar74;
  bool bVar75;
  float fVar76;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar77;
  float fVar113;
  float fVar114;
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar90 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar115;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  vint4 bi_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar128 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vint4 bi_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar186;
  float fVar200;
  float fVar202;
  vint4 bi;
  float fVar204;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar201;
  float fVar203;
  float fVar205;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar206;
  undefined1 auVar199 [32];
  float fVar207;
  float fVar208;
  float fVar235;
  float fVar237;
  vint4 ai_2;
  undefined1 auVar209 [16];
  float fVar239;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar236;
  float fVar238;
  float fVar240;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar241;
  float fVar255;
  float fVar256;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar257;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar258;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  vint4 ai;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar270 [16];
  vint4 ai_1;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  float fVar282;
  float fVar283;
  float fVar299;
  float fVar301;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar300;
  float fVar302;
  float fVar303;
  undefined1 auVar298 [32];
  float fVar304;
  float fVar312;
  float fVar313;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar310 [32];
  float fVar314;
  undefined1 auVar311 [32];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [64];
  float fVar335;
  float fVar342;
  float fVar343;
  vfloat4 a0;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar344;
  undefined1 auVar341 [16];
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar355;
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  float fVar368;
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  uint auStack_4b0 [4];
  RTCFilterFunctionNArguments local_4a0;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar70;
  undefined1 auVar269 [32];
  undefined1 auVar364 [32];
  
  PVar8 = prim[1];
  uVar66 = (ulong)(byte)PVar8;
  auVar290 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  lVar68 = uVar66 * 0x25;
  auVar180 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar319 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xf + 6)));
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x11 + 6)));
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1a + 6)));
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1b + 6)));
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  fVar185 = *(float *)(prim + lVar68 + 0x12);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar356._0_4_ = fVar185 * auVar94._0_4_;
  auVar356._4_4_ = fVar185 * auVar94._4_4_;
  auVar356._8_4_ = fVar185 * auVar94._8_4_;
  auVar356._12_4_ = fVar185 * auVar94._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar290);
  auVar214 = vcvtdq2ps_avx(auVar180);
  auVar131 = vcvtdq2ps_avx(auVar319);
  auVar270 = vcvtdq2ps_avx(auVar142);
  auVar16 = vcvtdq2ps_avx(auVar130);
  auVar119 = vcvtdq2ps_avx(auVar166);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1c + 6)));
  auVar153 = vcvtdq2ps_avx(auVar94);
  auVar94 = vshufps_avx(auVar356,auVar356,0);
  auVar290 = vshufps_avx(auVar356,auVar356,0x55);
  auVar180 = vshufps_avx(auVar356,auVar356,0xaa);
  fVar200 = auVar180._0_4_;
  fVar204 = auVar180._4_4_;
  fVar235 = auVar180._8_4_;
  fVar239 = auVar180._12_4_;
  fVar202 = auVar290._0_4_;
  fVar207 = auVar290._4_4_;
  fVar237 = auVar290._8_4_;
  fVar241 = auVar290._12_4_;
  fVar255 = auVar94._0_4_;
  fVar256 = auVar94._4_4_;
  fVar257 = auVar94._8_4_;
  fVar76 = auVar94._12_4_;
  auVar259._0_4_ = fVar255 * auVar15._0_4_ + auVar214._0_4_ * fVar202 + auVar131._0_4_ * fVar200;
  auVar259._4_4_ = fVar256 * auVar15._4_4_ + auVar214._4_4_ * fVar207 + auVar131._4_4_ * fVar204;
  auVar259._8_4_ = fVar257 * auVar15._8_4_ + auVar214._8_4_ * fVar237 + auVar131._8_4_ * fVar235;
  auVar259._12_4_ = fVar76 * auVar15._12_4_ + auVar214._12_4_ * fVar241 + auVar131._12_4_ * fVar239;
  auVar271._0_4_ = auVar16._0_4_ * fVar202 + auVar119._0_4_ * fVar200 + fVar255 * auVar270._0_4_;
  auVar271._4_4_ = auVar16._4_4_ * fVar207 + auVar119._4_4_ * fVar204 + fVar256 * auVar270._4_4_;
  auVar271._8_4_ = auVar16._8_4_ * fVar237 + auVar119._8_4_ * fVar235 + fVar257 * auVar270._8_4_;
  auVar271._12_4_ = auVar16._12_4_ * fVar241 + auVar119._12_4_ * fVar239 + fVar76 * auVar270._12_4_;
  auVar242._0_4_ = fVar255 * auVar120._0_4_ + fVar202 * auVar121._0_4_ + auVar153._0_4_ * fVar200;
  auVar242._4_4_ = fVar256 * auVar120._4_4_ + fVar207 * auVar121._4_4_ + auVar153._4_4_ * fVar204;
  auVar242._8_4_ = fVar257 * auVar120._8_4_ + fVar237 * auVar121._8_4_ + auVar153._8_4_ * fVar235;
  auVar242._12_4_ = fVar76 * auVar120._12_4_ + fVar241 * auVar121._12_4_ + auVar153._12_4_ * fVar239
  ;
  auVar78._8_4_ = 0x7fffffff;
  auVar78._0_8_ = 0x7fffffff7fffffff;
  auVar78._12_4_ = 0x7fffffff;
  auVar94 = vandps_avx(auVar259,auVar78);
  auVar357._8_4_ = 0x219392ef;
  auVar357._0_8_ = 0x219392ef219392ef;
  auVar357._12_4_ = 0x219392ef;
  auVar94 = vcmpps_avx(auVar94,auVar357,1);
  auVar142 = vblendvps_avx(auVar259,auVar357,auVar94);
  auVar94 = vandps_avx(auVar271,auVar78);
  auVar94 = vcmpps_avx(auVar94,auVar357,1);
  auVar130 = vblendvps_avx(auVar271,auVar357,auVar94);
  auVar94 = vandps_avx(auVar242,auVar78);
  auVar94 = vcmpps_avx(auVar94,auVar357,1);
  auVar166 = vblendvps_avx(auVar242,auVar357,auVar94);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar94 = vsubps_avx(auVar94,*(undefined1 (*) [16])(prim + lVar68 + 6));
  auVar358._0_4_ = fVar185 * auVar94._0_4_;
  auVar358._4_4_ = fVar185 * auVar94._4_4_;
  auVar358._8_4_ = fVar185 * auVar94._8_4_;
  auVar358._12_4_ = fVar185 * auVar94._12_4_;
  auVar94 = vshufps_avx(auVar358,auVar358,0xaa);
  fVar185 = auVar94._0_4_;
  fVar202 = auVar94._4_4_;
  fVar207 = auVar94._8_4_;
  fVar237 = auVar94._12_4_;
  auVar94 = vshufps_avx(auVar358,auVar358,0x55);
  fVar200 = auVar94._0_4_;
  fVar204 = auVar94._4_4_;
  fVar235 = auVar94._8_4_;
  fVar239 = auVar94._12_4_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar94 = vpmovsxwd_avx(auVar94);
  auVar290._8_8_ = 0;
  auVar290._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar290 = vpmovsxwd_avx(auVar290);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar180 = vpmovsxwd_avx(auVar180);
  auVar319._8_8_ = 0;
  auVar319._0_8_ = *(ulong *)(prim + uVar66 * 0xd + 6);
  auVar319 = vpmovsxwd_avx(auVar319);
  auVar78 = vshufps_avx(auVar358,auVar358,0);
  fVar241 = auVar78._0_4_;
  fVar255 = auVar78._4_4_;
  fVar256 = auVar78._8_4_;
  fVar257 = auVar78._12_4_;
  auVar365._0_4_ = fVar200 * auVar214._0_4_ + fVar185 * auVar131._0_4_ + fVar241 * auVar15._0_4_;
  auVar365._4_4_ = fVar204 * auVar214._4_4_ + fVar202 * auVar131._4_4_ + fVar255 * auVar15._4_4_;
  auVar365._8_4_ = fVar235 * auVar214._8_4_ + fVar207 * auVar131._8_4_ + fVar256 * auVar15._8_4_;
  auVar365._12_4_ = fVar239 * auVar214._12_4_ + fVar237 * auVar131._12_4_ + fVar257 * auVar15._12_4_
  ;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar66 * 0x12 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar152._0_4_ = fVar241 * auVar270._0_4_ + fVar200 * auVar16._0_4_ + fVar185 * auVar119._0_4_;
  auVar152._4_4_ = fVar255 * auVar270._4_4_ + fVar204 * auVar16._4_4_ + fVar202 * auVar119._4_4_;
  auVar152._8_4_ = fVar256 * auVar270._8_4_ + fVar235 * auVar16._8_4_ + fVar207 * auVar119._8_4_;
  auVar152._12_4_ = fVar257 * auVar270._12_4_ + fVar239 * auVar16._12_4_ + fVar237 * auVar119._12_4_
  ;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar66 * 0x16 + 6);
  auVar214 = vpmovsxwd_avx(auVar214);
  auVar119._0_4_ = fVar185 * auVar153._0_4_ + fVar200 * auVar121._0_4_ + fVar241 * auVar120._0_4_;
  auVar119._4_4_ = fVar202 * auVar153._4_4_ + fVar204 * auVar121._4_4_ + fVar255 * auVar120._4_4_;
  auVar119._8_4_ = fVar207 * auVar153._8_4_ + fVar235 * auVar121._8_4_ + fVar256 * auVar120._8_4_;
  auVar119._12_4_ =
       fVar237 * auVar153._12_4_ + fVar239 * auVar121._12_4_ + fVar257 * auVar120._12_4_;
  auVar131 = vrcpps_avx(auVar142);
  fVar185 = auVar131._0_4_;
  auVar260._0_4_ = fVar185 * auVar142._0_4_;
  fVar200 = auVar131._4_4_;
  auVar260._4_4_ = fVar200 * auVar142._4_4_;
  fVar202 = auVar131._8_4_;
  auVar260._8_4_ = fVar202 * auVar142._8_4_;
  fVar204 = auVar131._12_4_;
  auVar260._12_4_ = fVar204 * auVar142._12_4_;
  auVar349._8_4_ = 0x3f800000;
  auVar349._0_8_ = 0x3f8000003f800000;
  auVar349._12_4_ = 0x3f800000;
  auVar142 = vsubps_avx(auVar349,auVar260);
  fVar185 = fVar185 + fVar185 * auVar142._0_4_;
  fVar200 = fVar200 + fVar200 * auVar142._4_4_;
  fVar202 = fVar202 + fVar202 * auVar142._8_4_;
  fVar204 = fVar204 + fVar204 * auVar142._12_4_;
  auVar142 = vrcpps_avx(auVar130);
  fVar207 = auVar142._0_4_;
  auVar209._0_4_ = fVar207 * auVar130._0_4_;
  fVar235 = auVar142._4_4_;
  auVar209._4_4_ = fVar235 * auVar130._4_4_;
  fVar237 = auVar142._8_4_;
  auVar209._8_4_ = fVar237 * auVar130._8_4_;
  fVar239 = auVar142._12_4_;
  auVar209._12_4_ = fVar239 * auVar130._12_4_;
  auVar142 = vsubps_avx(auVar349,auVar209);
  fVar207 = fVar207 + fVar207 * auVar142._0_4_;
  fVar235 = fVar235 + fVar235 * auVar142._4_4_;
  fVar237 = fVar237 + fVar237 * auVar142._8_4_;
  fVar239 = fVar239 + fVar239 * auVar142._12_4_;
  auVar142 = vrcpps_avx(auVar166);
  fVar241 = auVar142._0_4_;
  auVar243._0_4_ = fVar241 * auVar166._0_4_;
  fVar255 = auVar142._4_4_;
  auVar243._4_4_ = fVar255 * auVar166._4_4_;
  fVar256 = auVar142._8_4_;
  auVar243._8_4_ = fVar256 * auVar166._8_4_;
  fVar257 = auVar142._12_4_;
  auVar243._12_4_ = fVar257 * auVar166._12_4_;
  auVar142 = vsubps_avx(auVar349,auVar243);
  fVar241 = fVar241 + fVar241 * auVar142._0_4_;
  fVar255 = fVar255 + fVar255 * auVar142._4_4_;
  fVar256 = fVar256 + fVar256 * auVar142._8_4_;
  fVar257 = fVar257 + fVar257 * auVar142._12_4_;
  auVar142 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar68 + 0x16)) *
                           *(float *)(prim + lVar68 + 0x1a)));
  auVar142 = vshufps_avx(auVar142,auVar142,0);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar290 = vcvtdq2ps_avx(auVar290);
  auVar290 = vsubps_avx(auVar290,auVar94);
  fVar76 = auVar142._0_4_;
  fVar77 = auVar142._4_4_;
  fVar186 = auVar142._8_4_;
  fVar201 = auVar142._12_4_;
  auVar261._0_4_ = fVar76 * auVar290._0_4_ + auVar94._0_4_;
  auVar261._4_4_ = fVar77 * auVar290._4_4_ + auVar94._4_4_;
  auVar261._8_4_ = fVar186 * auVar290._8_4_ + auVar94._8_4_;
  auVar261._12_4_ = fVar201 * auVar290._12_4_ + auVar94._12_4_;
  auVar94 = vcvtdq2ps_avx(auVar180);
  auVar290 = vcvtdq2ps_avx(auVar319);
  auVar290 = vsubps_avx(auVar290,auVar94);
  auVar272._0_4_ = fVar76 * auVar290._0_4_ + auVar94._0_4_;
  auVar272._4_4_ = fVar77 * auVar290._4_4_ + auVar94._4_4_;
  auVar272._8_4_ = fVar186 * auVar290._8_4_ + auVar94._8_4_;
  auVar272._12_4_ = fVar201 * auVar290._12_4_ + auVar94._12_4_;
  auVar94 = vcvtdq2ps_avx(auVar15);
  auVar290 = vcvtdq2ps_avx(auVar214);
  auVar290 = vsubps_avx(auVar290,auVar94);
  auVar284._0_4_ = auVar94._0_4_ + fVar76 * auVar290._0_4_;
  auVar284._4_4_ = auVar94._4_4_ + fVar77 * auVar290._4_4_;
  auVar284._8_4_ = auVar94._8_4_ + fVar186 * auVar290._8_4_;
  auVar284._12_4_ = auVar94._12_4_ + fVar201 * auVar290._12_4_;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar66 * 0x14 + 6);
  auVar94 = vpmovsxwd_avx(auVar142);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar66 * 0x18 + 6);
  auVar290 = vpmovsxwd_avx(auVar130);
  auVar290 = vcvtdq2ps_avx(auVar290);
  auVar290 = vsubps_avx(auVar290,auVar94);
  auVar305._0_4_ = fVar76 * auVar290._0_4_ + auVar94._0_4_;
  auVar305._4_4_ = fVar77 * auVar290._4_4_ + auVar94._4_4_;
  auVar305._8_4_ = fVar186 * auVar290._8_4_ + auVar94._8_4_;
  auVar305._12_4_ = fVar201 * auVar290._12_4_ + auVar94._12_4_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar66 * 0x1d + 6);
  auVar94 = vpmovsxwd_avx(auVar166);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar66 * 0x21 + 6);
  auVar290 = vpmovsxwd_avx(auVar131);
  auVar290 = vcvtdq2ps_avx(auVar290);
  auVar180 = vsubps_avx(auVar290,auVar94);
  auVar270._8_8_ = 0;
  auVar270._0_8_ = *(ulong *)(prim + uVar66 * 0x1f + 6);
  auVar290 = vpmovsxwd_avx(auVar270);
  auVar318._0_4_ = fVar76 * auVar180._0_4_ + auVar94._0_4_;
  auVar318._4_4_ = fVar77 * auVar180._4_4_ + auVar94._4_4_;
  auVar318._8_4_ = fVar186 * auVar180._8_4_ + auVar94._8_4_;
  auVar318._12_4_ = fVar201 * auVar180._12_4_ + auVar94._12_4_;
  auVar94 = vcvtdq2ps_avx(auVar290);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar66 * 0x23 + 6);
  auVar290 = vpmovsxwd_avx(auVar16);
  auVar290 = vcvtdq2ps_avx(auVar290);
  auVar290 = vsubps_avx(auVar290,auVar94);
  auVar327._0_4_ = fVar76 * auVar290._0_4_ + auVar94._0_4_;
  auVar327._4_4_ = fVar77 * auVar290._4_4_ + auVar94._4_4_;
  auVar327._8_4_ = fVar186 * auVar290._8_4_ + auVar94._8_4_;
  auVar327._12_4_ = fVar201 * auVar290._12_4_ + auVar94._12_4_;
  auVar94 = vsubps_avx(auVar261,auVar365);
  auVar262._0_4_ = fVar185 * auVar94._0_4_;
  auVar262._4_4_ = fVar200 * auVar94._4_4_;
  auVar262._8_4_ = fVar202 * auVar94._8_4_;
  auVar262._12_4_ = fVar204 * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar272,auVar365);
  auVar187._0_4_ = fVar185 * auVar94._0_4_;
  auVar187._4_4_ = fVar200 * auVar94._4_4_;
  auVar187._8_4_ = fVar202 * auVar94._8_4_;
  auVar187._12_4_ = fVar204 * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar284,auVar152);
  auVar273._0_4_ = fVar207 * auVar94._0_4_;
  auVar273._4_4_ = fVar235 * auVar94._4_4_;
  auVar273._8_4_ = fVar237 * auVar94._8_4_;
  auVar273._12_4_ = fVar239 * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar305,auVar152);
  auVar153._0_4_ = fVar207 * auVar94._0_4_;
  auVar153._4_4_ = fVar235 * auVar94._4_4_;
  auVar153._8_4_ = fVar237 * auVar94._8_4_;
  auVar153._12_4_ = fVar239 * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar318,auVar119);
  auVar210._0_4_ = fVar241 * auVar94._0_4_;
  auVar210._4_4_ = fVar255 * auVar94._4_4_;
  auVar210._8_4_ = fVar256 * auVar94._8_4_;
  auVar210._12_4_ = fVar257 * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar327,auVar119);
  auVar120._0_4_ = fVar241 * auVar94._0_4_;
  auVar120._4_4_ = fVar255 * auVar94._4_4_;
  auVar120._8_4_ = fVar256 * auVar94._8_4_;
  auVar120._12_4_ = fVar257 * auVar94._12_4_;
  auVar94 = vpminsd_avx(auVar262,auVar187);
  auVar290 = vpminsd_avx(auVar273,auVar153);
  auVar94 = vmaxps_avx(auVar94,auVar290);
  auVar290 = vpminsd_avx(auVar210,auVar120);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar306._4_4_ = uVar73;
  auVar306._0_4_ = uVar73;
  auVar306._8_4_ = uVar73;
  auVar306._12_4_ = uVar73;
  auVar290 = vmaxps_avx(auVar290,auVar306);
  auVar94 = vmaxps_avx(auVar94,auVar290);
  local_430._0_4_ = auVar94._0_4_ * 0.99999964;
  local_430._4_4_ = auVar94._4_4_ * 0.99999964;
  local_430._8_4_ = auVar94._8_4_ * 0.99999964;
  local_430._12_4_ = auVar94._12_4_ * 0.99999964;
  auVar94 = vpmaxsd_avx(auVar262,auVar187);
  auVar290 = vpmaxsd_avx(auVar273,auVar153);
  auVar94 = vminps_avx(auVar94,auVar290);
  auVar290 = vpmaxsd_avx(auVar210,auVar120);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar188._4_4_ = uVar73;
  auVar188._0_4_ = uVar73;
  auVar188._8_4_ = uVar73;
  auVar188._12_4_ = uVar73;
  auVar290 = vminps_avx(auVar290,auVar188);
  auVar94 = vminps_avx(auVar94,auVar290);
  auVar121._0_4_ = auVar94._0_4_ * 1.0000004;
  auVar121._4_4_ = auVar94._4_4_ * 1.0000004;
  auVar121._8_4_ = auVar94._8_4_ * 1.0000004;
  auVar121._12_4_ = auVar94._12_4_ * 1.0000004;
  auVar94 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar290 = vpcmpgtd_avx(auVar94,_DAT_01f4ad30);
  auVar94 = vcmpps_avx(local_430,auVar121,2);
  auVar94 = vandps_avx(auVar94,auVar290);
  uVar73 = vmovmskps_avx(auVar94);
  uVar66 = CONCAT44((int)((ulong)prim >> 0x20),uVar73);
  auVar106._16_16_ = mm_lookupmask_ps._240_16_;
  auVar106._0_16_ = mm_lookupmask_ps._240_16_;
  uVar72 = 1 << ((byte)k & 0x1f);
  local_2e0 = vblendps_avx(auVar106,ZEXT832(0) << 0x20,0x80);
  auVar54 = ZEXT412(0);
LAB_008ef384:
  auVar56._12_4_ = 0;
  auVar56._0_12_ = auVar54;
  if (uVar66 == 0) {
LAB_008f176b:
    return uVar66 != 0;
  }
  lVar68 = 0;
  if (uVar66 != 0) {
    for (; (uVar66 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  uVar65 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar65].ptr;
  fVar185 = (pGVar9->time_range).lower;
  fVar185 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar185) / ((pGVar9->time_range).upper - fVar185));
  auVar94 = vroundss_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),9);
  auVar94 = vminss_avx(auVar94,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar94 = vmaxss_avx(auVar56 << 0x20,auVar94);
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(prim + lVar68 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar74 = (long)(int)auVar94._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar74);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar74);
  pfVar4 = (float *)(lVar11 + lVar12 * uVar69);
  fVar200 = *pfVar4;
  fVar202 = pfVar4[1];
  fVar204 = pfVar4[2];
  fVar207 = pfVar4[3];
  lVar1 = uVar69 + 1;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar235 = *pfVar4;
  fVar237 = pfVar4[1];
  fVar239 = pfVar4[2];
  fVar241 = pfVar4[3];
  lVar2 = uVar69 + 2;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar255 = *pfVar4;
  fVar256 = pfVar4[1];
  fVar257 = pfVar4[2];
  fVar76 = pfVar4[3];
  lVar3 = uVar69 + 3;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar77 = *pfVar4;
  fVar186 = pfVar4[1];
  fVar201 = pfVar4[2];
  fVar203 = pfVar4[3];
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar74);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar74);
  pfVar4 = (float *)(lVar12 + lVar13 * uVar69);
  fVar205 = *pfVar4;
  fVar208 = pfVar4[1];
  fVar236 = pfVar4[2];
  fVar238 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar1);
  fVar240 = *pfVar4;
  fVar113 = pfVar4[1];
  fVar114 = pfVar4[2];
  fVar115 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar116 = *pfVar4;
  fVar117 = pfVar4[1];
  fVar118 = pfVar4[2];
  fVar206 = pfVar4[3];
  fVar185 = fVar185 - auVar94._0_4_;
  pfVar4 = (float *)(lVar12 + lVar13 * lVar3);
  fVar258 = *pfVar4;
  fVar282 = pfVar4[1];
  fVar283 = pfVar4[2];
  fVar299 = pfVar4[3];
  local_700._0_4_ = fVar200 * 0.16666667 + fVar235 * 0.6666667 + fVar255 * 0.16666667 + fVar77 * 0.0
  ;
  local_700._4_4_ =
       fVar202 * 0.16666667 + fVar237 * 0.6666667 + fVar256 * 0.16666667 + fVar186 * 0.0;
  fStack_6f8 = fVar204 * 0.16666667 + fVar239 * 0.6666667 + fVar257 * 0.16666667 + fVar201 * 0.0;
  fStack_6f4 = fVar207 * 0.16666667 + fVar241 * 0.6666667 + fVar76 * 0.16666667 + fVar203 * 0.0;
  auVar79._0_4_ = fVar255 * 0.5 + fVar77 * 0.0;
  auVar79._4_4_ = fVar256 * 0.5 + fVar186 * 0.0;
  auVar79._8_4_ = fVar257 * 0.5 + fVar201 * 0.0;
  auVar79._12_4_ = fVar76 * 0.5 + fVar203 * 0.0;
  auVar154._0_4_ = fVar235 * 0.0;
  auVar154._4_4_ = fVar237 * 0.0;
  auVar154._8_4_ = fVar239 * 0.0;
  auVar154._12_4_ = fVar241 * 0.0;
  auVar94 = vsubps_avx(auVar79,auVar154);
  auVar155._0_4_ = fVar200 * 0.5;
  auVar155._4_4_ = fVar202 * 0.5;
  auVar155._8_4_ = fVar204 * 0.5;
  auVar155._12_4_ = fVar207 * 0.5;
  auVar142 = vsubps_avx(auVar94,auVar155);
  auVar80._0_4_ = fVar205 * 0.16666667 + fVar240 * 0.6666667 + fVar116 * 0.16666667 + fVar258 * 0.0;
  auVar80._4_4_ = fVar208 * 0.16666667 + fVar113 * 0.6666667 + fVar117 * 0.16666667 + fVar282 * 0.0;
  auVar80._8_4_ = fVar236 * 0.16666667 + fVar114 * 0.6666667 + fVar118 * 0.16666667 + fVar283 * 0.0;
  auVar80._12_4_ = fVar238 * 0.16666667 + fVar115 * 0.6666667 + fVar206 * 0.16666667 + fVar299 * 0.0
  ;
  auVar263._0_4_ = fVar116 * 0.5 + fVar258 * 0.0;
  auVar263._4_4_ = fVar117 * 0.5 + fVar282 * 0.0;
  auVar263._8_4_ = fVar118 * 0.5 + fVar283 * 0.0;
  auVar263._12_4_ = fVar206 * 0.5 + fVar299 * 0.0;
  auVar336._0_4_ = fVar240 * 0.0;
  auVar336._4_4_ = fVar113 * 0.0;
  auVar336._8_4_ = fVar114 * 0.0;
  auVar336._12_4_ = fVar115 * 0.0;
  auVar94 = vsubps_avx(auVar263,auVar336);
  auVar337._0_4_ = fVar205 * 0.5;
  auVar337._4_4_ = fVar208 * 0.5;
  auVar337._8_4_ = fVar236 * 0.5;
  auVar337._12_4_ = fVar238 * 0.5;
  auVar319 = vsubps_avx(auVar94,auVar337);
  auVar211._0_4_ = fVar200 * 0.0;
  auVar211._4_4_ = fVar202 * 0.0;
  auVar211._8_4_ = fVar204 * 0.0;
  auVar211._12_4_ = fVar207 * 0.0;
  local_6b0._0_4_ =
       auVar211._0_4_ + fVar235 * 0.16666667 + fVar255 * 0.6666667 + fVar77 * 0.16666667;
  local_6b0._4_4_ =
       auVar211._4_4_ + fVar237 * 0.16666667 + fVar256 * 0.6666667 + fVar186 * 0.16666667;
  fStack_6a8 = auVar211._8_4_ + fVar239 * 0.16666667 + fVar257 * 0.6666667 + fVar201 * 0.16666667;
  fStack_6a4 = auVar211._12_4_ + fVar241 * 0.16666667 + fVar76 * 0.6666667 + fVar203 * 0.16666667;
  auVar274._0_4_ = fVar77 * 0.5 + fVar255 * 0.0;
  auVar274._4_4_ = fVar186 * 0.5 + fVar256 * 0.0;
  auVar274._8_4_ = fVar201 * 0.5 + fVar257 * 0.0;
  auVar274._12_4_ = fVar203 * 0.5 + fVar76 * 0.0;
  auVar189._0_4_ = fVar235 * 0.5;
  auVar189._4_4_ = fVar237 * 0.5;
  auVar189._8_4_ = fVar239 * 0.5;
  auVar189._12_4_ = fVar241 * 0.5;
  auVar94 = vsubps_avx(auVar274,auVar189);
  auVar130 = vsubps_avx(auVar94,auVar211);
  auVar212._0_4_ = fVar205 * 0.0;
  auVar212._4_4_ = fVar208 * 0.0;
  auVar212._8_4_ = fVar236 * 0.0;
  auVar212._12_4_ = fVar238 * 0.0;
  auVar190._0_4_ =
       auVar212._0_4_ + fVar240 * 0.16666667 + fVar116 * 0.6666667 + fVar258 * 0.16666667;
  auVar190._4_4_ =
       auVar212._4_4_ + fVar113 * 0.16666667 + fVar117 * 0.6666667 + fVar282 * 0.16666667;
  auVar190._8_4_ =
       auVar212._8_4_ + fVar114 * 0.16666667 + fVar118 * 0.6666667 + fVar283 * 0.16666667;
  auVar190._12_4_ =
       auVar212._12_4_ + fVar115 * 0.16666667 + fVar206 * 0.6666667 + fVar299 * 0.16666667;
  auVar275._0_4_ = fVar116 * 0.0 + fVar258 * 0.5;
  auVar275._4_4_ = fVar117 * 0.0 + fVar282 * 0.5;
  auVar275._8_4_ = fVar118 * 0.0 + fVar283 * 0.5;
  auVar275._12_4_ = fVar206 * 0.0 + fVar299 * 0.5;
  auVar244._0_4_ = fVar240 * 0.5;
  auVar244._4_4_ = fVar113 * 0.5;
  auVar244._8_4_ = fVar114 * 0.5;
  auVar244._12_4_ = fVar115 * 0.5;
  auVar94 = vsubps_avx(auVar275,auVar244);
  auVar214 = vsubps_avx(auVar94,auVar212);
  auVar94 = vshufps_avx(auVar142,auVar142,0xc9);
  auVar290 = vshufps_avx(auVar80,auVar80,0xc9);
  fVar117 = auVar142._0_4_;
  auVar276._0_4_ = fVar117 * auVar290._0_4_;
  fVar118 = auVar142._4_4_;
  auVar276._4_4_ = fVar118 * auVar290._4_4_;
  fVar206 = auVar142._8_4_;
  auVar276._8_4_ = fVar206 * auVar290._8_4_;
  fVar258 = auVar142._12_4_;
  auVar276._12_4_ = fVar258 * auVar290._12_4_;
  auVar81._0_4_ = auVar94._0_4_ * auVar80._0_4_;
  auVar81._4_4_ = auVar94._4_4_ * auVar80._4_4_;
  auVar81._8_4_ = auVar94._8_4_ * auVar80._8_4_;
  auVar81._12_4_ = auVar94._12_4_ * auVar80._12_4_;
  auVar290 = vsubps_avx(auVar81,auVar276);
  auVar180 = vshufps_avx(auVar290,auVar290,0xc9);
  auVar290 = vshufps_avx(auVar319,auVar319,0xc9);
  auVar277._0_4_ = fVar117 * auVar290._0_4_;
  auVar277._4_4_ = fVar118 * auVar290._4_4_;
  auVar277._8_4_ = fVar206 * auVar290._8_4_;
  auVar277._12_4_ = fVar258 * auVar290._12_4_;
  auVar245._0_4_ = auVar319._0_4_ * auVar94._0_4_;
  auVar245._4_4_ = auVar319._4_4_ * auVar94._4_4_;
  auVar245._8_4_ = auVar319._8_4_ * auVar94._8_4_;
  auVar245._12_4_ = auVar319._12_4_ * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar245,auVar277);
  auVar319 = vshufps_avx(auVar94,auVar94,0xc9);
  auVar94 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar290 = vshufps_avx(auVar190,auVar190,0xc9);
  fVar282 = auVar130._0_4_;
  auVar285._0_4_ = fVar282 * auVar290._0_4_;
  fVar283 = auVar130._4_4_;
  auVar285._4_4_ = fVar283 * auVar290._4_4_;
  fVar299 = auVar130._8_4_;
  auVar285._8_4_ = fVar299 * auVar290._8_4_;
  fVar300 = auVar130._12_4_;
  auVar285._12_4_ = fVar300 * auVar290._12_4_;
  auVar191._0_4_ = auVar94._0_4_ * auVar190._0_4_;
  auVar191._4_4_ = auVar94._4_4_ * auVar190._4_4_;
  auVar191._8_4_ = auVar94._8_4_ * auVar190._8_4_;
  auVar191._12_4_ = auVar94._12_4_ * auVar190._12_4_;
  auVar290 = vsubps_avx(auVar191,auVar285);
  auVar15 = vshufps_avx(auVar290,auVar290,0xc9);
  auVar290 = vshufps_avx(auVar214,auVar214,0xc9);
  auVar286._0_4_ = fVar282 * auVar290._0_4_;
  auVar286._4_4_ = fVar283 * auVar290._4_4_;
  auVar286._8_4_ = fVar299 * auVar290._8_4_;
  auVar286._12_4_ = fVar300 * auVar290._12_4_;
  auVar213._0_4_ = auVar94._0_4_ * auVar214._0_4_;
  auVar213._4_4_ = auVar94._4_4_ * auVar214._4_4_;
  auVar213._8_4_ = auVar94._8_4_ * auVar214._8_4_;
  auVar213._12_4_ = auVar94._12_4_ * auVar214._12_4_;
  auVar166 = vsubps_avx(auVar213,auVar286);
  auVar94 = vdpps_avx(auVar180,auVar180,0x7f);
  fVar202 = auVar94._0_4_;
  auVar270 = ZEXT416((uint)fVar202);
  auVar290 = vrsqrtss_avx(auVar270,auVar270);
  fVar200 = auVar290._0_4_;
  auVar290 = vdpps_avx(auVar180,auVar319,0x7f);
  auVar214 = ZEXT416((uint)(fVar200 * 1.5 - fVar202 * 0.5 * fVar200 * fVar200 * fVar200));
  auVar214 = vshufps_avx(auVar214,auVar214,0);
  fVar208 = auVar214._0_4_ * auVar180._0_4_;
  fVar236 = auVar214._4_4_ * auVar180._4_4_;
  fVar238 = auVar214._8_4_ * auVar180._8_4_;
  fVar240 = auVar214._12_4_ * auVar180._12_4_;
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar278._0_4_ = auVar94._0_4_ * auVar319._0_4_;
  auVar278._4_4_ = auVar94._4_4_ * auVar319._4_4_;
  auVar278._8_4_ = auVar94._8_4_ * auVar319._8_4_;
  auVar278._12_4_ = auVar94._12_4_ * auVar319._12_4_;
  auVar94 = vshufps_avx(auVar290,auVar290,0);
  auVar82._0_4_ = auVar94._0_4_ * auVar180._0_4_;
  auVar82._4_4_ = auVar94._4_4_ * auVar180._4_4_;
  auVar82._8_4_ = auVar94._8_4_ * auVar180._8_4_;
  auVar82._12_4_ = auVar94._12_4_ * auVar180._12_4_;
  auVar131 = vsubps_avx(auVar278,auVar82);
  auVar94 = vrcpss_avx(auVar270,auVar270);
  auVar94 = ZEXT416((uint)((2.0 - fVar202 * auVar94._0_4_) * auVar94._0_4_));
  auVar180 = vshufps_avx(auVar94,auVar94,0);
  auVar94 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar113 = auVar94._0_4_;
  auVar319 = ZEXT416((uint)fVar113);
  auVar290 = vrsqrtss_avx(auVar319,auVar319);
  fVar186 = auVar290._0_4_;
  lVar12 = *(long *)(_Var10 + 0x38 + lVar74);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar74);
  pauVar5 = (undefined1 (*) [12])(lVar12 + lVar13 * uVar69);
  auVar54 = *pauVar5;
  fVar200 = *(float *)pauVar5[1];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar1);
  fVar202 = *pfVar4;
  fVar204 = pfVar4[1];
  fVar207 = pfVar4[2];
  fVar235 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar237 = *pfVar4;
  fVar239 = pfVar4[1];
  fVar241 = pfVar4[2];
  fVar255 = pfVar4[3];
  auVar290 = vshufps_avx(auVar166,auVar166,0xc9);
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar359._0_4_ = auVar94._0_4_ * auVar290._0_4_;
  auVar359._4_4_ = auVar94._4_4_ * auVar290._4_4_;
  auVar359._8_4_ = auVar94._8_4_ * auVar290._8_4_;
  auVar359._12_4_ = auVar94._12_4_ * auVar290._12_4_;
  auVar94 = vdpps_avx(auVar15,auVar290,0x7f);
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar83._0_4_ = auVar94._0_4_ * auVar15._0_4_;
  auVar83._4_4_ = auVar94._4_4_ * auVar15._4_4_;
  auVar83._8_4_ = auVar94._8_4_ * auVar15._8_4_;
  auVar83._12_4_ = auVar94._12_4_ * auVar15._12_4_;
  auVar166 = vsubps_avx(auVar359,auVar83);
  pfVar4 = (float *)(lVar12 + lVar13 * lVar3);
  fVar256 = *pfVar4;
  fVar257 = pfVar4[1];
  fVar76 = pfVar4[2];
  fVar77 = pfVar4[3];
  lVar12 = *(long *)(lVar11 + 0x38 + lVar74);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar74);
  auVar94 = ZEXT416((uint)(fVar186 * 1.5 - fVar186 * fVar186 * fVar186 * fVar113 * 0.5));
  auVar290 = vshufps_avx(auVar94,auVar94,0);
  fVar186 = auVar15._0_4_ * auVar290._0_4_;
  fVar201 = auVar15._4_4_ * auVar290._4_4_;
  fVar203 = auVar15._8_4_ * auVar290._8_4_;
  fVar205 = auVar15._12_4_ * auVar290._12_4_;
  auVar94 = vrcpss_avx(auVar319,auVar319);
  auVar94 = ZEXT416((uint)(auVar94._0_4_ * (2.0 - fVar113 * auVar94._0_4_)));
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar319 = vshufps_avx(_local_700,_local_700,0xff);
  auVar320._0_4_ = auVar319._0_4_ * fVar208;
  auVar320._4_4_ = auVar319._4_4_ * fVar236;
  auVar320._8_4_ = auVar319._8_4_ * fVar238;
  auVar320._12_4_ = auVar319._12_4_ * fVar240;
  auVar15 = vshufps_avx(auVar142,auVar142,0xff);
  auVar270 = vsubps_avx(_local_700,auVar320);
  auVar215._0_4_ =
       auVar15._0_4_ * fVar208 + auVar319._0_4_ * auVar214._0_4_ * auVar131._0_4_ * auVar180._0_4_;
  auVar215._4_4_ =
       auVar15._4_4_ * fVar236 + auVar319._4_4_ * auVar214._4_4_ * auVar131._4_4_ * auVar180._4_4_;
  auVar215._8_4_ =
       auVar15._8_4_ * fVar238 + auVar319._8_4_ * auVar214._8_4_ * auVar131._8_4_ * auVar180._8_4_;
  auVar215._12_4_ =
       auVar15._12_4_ * fVar240 +
       auVar319._12_4_ * auVar214._12_4_ * auVar131._12_4_ * auVar180._12_4_;
  auVar142 = vsubps_avx(auVar142,auVar215);
  local_700._0_4_ = (float)local_700._0_4_ + auVar320._0_4_;
  local_700._4_4_ = (float)local_700._4_4_ + auVar320._4_4_;
  fStack_6f8 = fStack_6f8 + auVar320._8_4_;
  fStack_6f4 = fStack_6f4 + auVar320._12_4_;
  auVar180 = vshufps_avx(_local_6b0,_local_6b0,0xff);
  auVar156._0_4_ = auVar180._0_4_ * fVar186;
  auVar156._4_4_ = auVar180._4_4_ * fVar201;
  auVar156._8_4_ = auVar180._8_4_ * fVar203;
  auVar156._12_4_ = auVar180._12_4_ * fVar205;
  auVar319 = vshufps_avx(auVar130,auVar130,0xff);
  auVar131 = vsubps_avx(_local_6b0,auVar156);
  auVar84._0_4_ =
       auVar319._0_4_ * fVar186 + auVar180._0_4_ * auVar290._0_4_ * auVar94._0_4_ * auVar166._0_4_;
  auVar84._4_4_ =
       auVar319._4_4_ * fVar201 + auVar180._4_4_ * auVar290._4_4_ * auVar94._4_4_ * auVar166._4_4_;
  auVar84._8_4_ =
       auVar319._8_4_ * fVar203 + auVar180._8_4_ * auVar290._8_4_ * auVar94._8_4_ * auVar166._8_4_;
  auVar84._12_4_ =
       auVar319._12_4_ * fVar205 +
       auVar180._12_4_ * auVar290._12_4_ * auVar94._12_4_ * auVar166._12_4_;
  auVar130 = vsubps_avx(auVar130,auVar84);
  local_6b0._0_4_ = (float)local_6b0._0_4_ + auVar156._0_4_;
  local_6b0._4_4_ = (float)local_6b0._4_4_ + auVar156._4_4_;
  fStack_6a8 = fStack_6a8 + auVar156._8_4_;
  fStack_6a4 = fStack_6a4 + auVar156._12_4_;
  local_6c0._0_4_ =
       *(float *)*pauVar5 * 0.16666667 + fVar202 * 0.6666667 + fVar237 * 0.16666667 + fVar256 * 0.0;
  local_6c0._4_4_ =
       *(float *)(*pauVar5 + 4) * 0.16666667 +
       fVar204 * 0.6666667 + fVar239 * 0.16666667 + fVar257 * 0.0;
  fStack_6b8 = *(float *)(*pauVar5 + 8) * 0.16666667 +
               fVar207 * 0.6666667 + fVar241 * 0.16666667 + fVar76 * 0.0;
  fStack_6b4 = fVar200 * 0.16666667 + fVar235 * 0.6666667 + fVar255 * 0.16666667 + fVar77 * 0.0;
  auVar85._0_4_ = fVar237 * 0.5 + fVar256 * 0.0;
  auVar85._4_4_ = fVar239 * 0.5 + fVar257 * 0.0;
  auVar85._8_4_ = fVar241 * 0.5 + fVar76 * 0.0;
  auVar85._12_4_ = fVar255 * 0.5 + fVar77 * 0.0;
  auVar122._0_4_ = fVar202 * 0.0;
  auVar122._4_4_ = fVar204 * 0.0;
  auVar122._8_4_ = fVar207 * 0.0;
  auVar122._12_4_ = fVar235 * 0.0;
  auVar94 = vsubps_avx(auVar85,auVar122);
  auVar123._0_4_ = *(float *)*pauVar5 * 0.5;
  auVar123._4_4_ = *(float *)(*pauVar5 + 4) * 0.5;
  auVar123._8_4_ = *(float *)(*pauVar5 + 8) * 0.5;
  auVar123._12_4_ = fVar200 * 0.5;
  auVar166 = vsubps_avx(auVar94,auVar123);
  auVar94 = *(undefined1 (*) [16])(lVar12 + lVar2 * lVar11);
  pfVar4 = (float *)(lVar12 + lVar11 * lVar3);
  fVar186 = *pfVar4;
  fVar201 = pfVar4[1];
  fVar203 = pfVar4[2];
  fVar205 = pfVar4[3];
  fVar335 = auVar94._0_4_;
  fVar301 = auVar94._4_4_;
  fVar342 = auVar94._8_4_;
  fVar302 = auVar94._12_4_;
  pfVar4 = (float *)(lVar12 + lVar1 * lVar11);
  fVar208 = *pfVar4;
  fVar236 = pfVar4[1];
  fVar238 = pfVar4[2];
  fVar240 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + uVar69 * lVar11);
  fVar113 = *pfVar4;
  fVar114 = pfVar4[1];
  fVar115 = pfVar4[2];
  fVar116 = pfVar4[3];
  auVar216._0_4_ = fVar113 * 0.16666667 + fVar208 * 0.6666667 + fVar335 * 0.16666667 + fVar186 * 0.0
  ;
  auVar216._4_4_ = fVar114 * 0.16666667 + fVar236 * 0.6666667 + fVar301 * 0.16666667 + fVar201 * 0.0
  ;
  auVar216._8_4_ = fVar115 * 0.16666667 + fVar238 * 0.6666667 + fVar342 * 0.16666667 + fVar203 * 0.0
  ;
  auVar216._12_4_ =
       fVar116 * 0.16666667 + fVar240 * 0.6666667 + fVar302 * 0.16666667 + fVar205 * 0.0;
  auVar192._0_4_ = fVar335 * 0.5 + fVar186 * 0.0;
  auVar192._4_4_ = fVar301 * 0.5 + fVar201 * 0.0;
  auVar192._8_4_ = fVar342 * 0.5 + fVar203 * 0.0;
  auVar192._12_4_ = fVar302 * 0.5 + fVar205 * 0.0;
  auVar287._0_4_ = fVar208 * 0.0;
  auVar287._4_4_ = fVar236 * 0.0;
  auVar287._8_4_ = fVar238 * 0.0;
  auVar287._12_4_ = fVar240 * 0.0;
  auVar94 = vsubps_avx(auVar192,auVar287);
  auVar288._0_4_ = fVar113 * 0.5;
  auVar288._4_4_ = fVar114 * 0.5;
  auVar288._8_4_ = fVar115 * 0.5;
  auVar288._12_4_ = fVar116 * 0.5;
  auVar290 = vsubps_avx(auVar94,auVar288);
  auVar289._0_4_ = fVar237 * 0.0 + fVar256 * 0.5;
  auVar289._4_4_ = fVar239 * 0.0 + fVar257 * 0.5;
  auVar289._8_4_ = fVar241 * 0.0 + fVar76 * 0.5;
  auVar289._12_4_ = fVar255 * 0.0 + fVar77 * 0.5;
  auVar338._0_4_ = fVar202 * 0.5;
  auVar338._4_4_ = fVar204 * 0.5;
  auVar338._8_4_ = fVar207 * 0.5;
  auVar338._12_4_ = fVar235 * 0.5;
  auVar94 = vsubps_avx(auVar289,auVar338);
  local_6d0 = auVar54._0_4_;
  fStack_6cc = auVar54._4_4_;
  fStack_6c8 = auVar54._8_4_;
  auVar328._0_4_ = local_6d0 * 0.0;
  auVar328._4_4_ = fStack_6cc * 0.0;
  auVar328._8_4_ = fStack_6c8 * 0.0;
  auVar328._12_4_ = fVar200 * 0.0;
  auVar339._0_4_ =
       auVar328._0_4_ + fVar202 * 0.16666667 + fVar256 * 0.16666667 + fVar237 * 0.6666667;
  auVar339._4_4_ =
       auVar328._4_4_ + fVar204 * 0.16666667 + fVar257 * 0.16666667 + fVar239 * 0.6666667;
  auVar339._8_4_ = auVar328._8_4_ + fVar207 * 0.16666667 + fVar76 * 0.16666667 + fVar241 * 0.6666667
  ;
  auVar339._12_4_ =
       auVar328._12_4_ + fVar235 * 0.16666667 + fVar77 * 0.16666667 + fVar255 * 0.6666667;
  auVar16 = vsubps_avx(auVar94,auVar328);
  auVar157._0_4_ = fVar335 * 0.0 + fVar186 * 0.5;
  auVar157._4_4_ = fVar301 * 0.0 + fVar201 * 0.5;
  auVar157._8_4_ = fVar342 * 0.0 + fVar203 * 0.5;
  auVar157._12_4_ = fVar302 * 0.0 + fVar205 * 0.5;
  auVar86._0_4_ = fVar208 * 0.5;
  auVar86._4_4_ = fVar236 * 0.5;
  auVar86._8_4_ = fVar238 * 0.5;
  auVar86._12_4_ = fVar240 * 0.5;
  auVar94 = vsubps_avx(auVar157,auVar86);
  auVar124._0_4_ = fVar113 * 0.0;
  auVar124._4_4_ = fVar114 * 0.0;
  auVar124._8_4_ = fVar115 * 0.0;
  auVar124._12_4_ = fVar116 * 0.0;
  auVar158._0_4_ =
       auVar124._0_4_ + fVar208 * 0.16666667 + fVar335 * 0.6666667 + fVar186 * 0.16666667;
  auVar158._4_4_ =
       auVar124._4_4_ + fVar236 * 0.16666667 + fVar301 * 0.6666667 + fVar201 * 0.16666667;
  auVar158._8_4_ =
       auVar124._8_4_ + fVar238 * 0.16666667 + fVar342 * 0.6666667 + fVar203 * 0.16666667;
  auVar158._12_4_ =
       auVar124._12_4_ + fVar240 * 0.16666667 + fVar302 * 0.6666667 + fVar205 * 0.16666667;
  auVar319 = vsubps_avx(auVar94,auVar124);
  auVar94 = vshufps_avx(auVar216,auVar216,0xc9);
  fVar255 = auVar166._0_4_;
  auVar125._0_4_ = fVar255 * auVar94._0_4_;
  fVar256 = auVar166._4_4_;
  auVar125._4_4_ = fVar256 * auVar94._4_4_;
  fVar257 = auVar166._8_4_;
  auVar125._8_4_ = fVar257 * auVar94._8_4_;
  fVar186 = auVar166._12_4_;
  auVar125._12_4_ = fVar186 * auVar94._12_4_;
  auVar94 = vshufps_avx(auVar166,auVar166,0xc9);
  auVar217._0_4_ = auVar94._0_4_ * auVar216._0_4_;
  auVar217._4_4_ = auVar94._4_4_ * auVar216._4_4_;
  auVar217._8_4_ = auVar94._8_4_ * auVar216._8_4_;
  auVar217._12_4_ = auVar94._12_4_ * auVar216._12_4_;
  auVar180 = vsubps_avx(auVar217,auVar125);
  auVar218._0_4_ = auVar94._0_4_ * auVar290._0_4_;
  auVar218._4_4_ = auVar94._4_4_ * auVar290._4_4_;
  auVar218._8_4_ = auVar94._8_4_ * auVar290._8_4_;
  auVar218._12_4_ = auVar94._12_4_ * auVar290._12_4_;
  auVar94 = vshufps_avx(auVar290,auVar290,0xc9);
  auVar193._0_4_ = fVar255 * auVar94._0_4_;
  auVar193._4_4_ = fVar256 * auVar94._4_4_;
  auVar193._8_4_ = fVar257 * auVar94._8_4_;
  auVar193._12_4_ = fVar186 * auVar94._12_4_;
  auVar15 = vsubps_avx(auVar218,auVar193);
  auVar94 = vshufps_avx(auVar158,auVar158,0xc9);
  fVar77 = auVar16._0_4_;
  auVar219._0_4_ = fVar77 * auVar94._0_4_;
  fVar203 = auVar16._4_4_;
  auVar219._4_4_ = fVar203 * auVar94._4_4_;
  fVar205 = auVar16._8_4_;
  auVar219._8_4_ = fVar205 * auVar94._8_4_;
  fVar236 = auVar16._12_4_;
  auVar219._12_4_ = fVar236 * auVar94._12_4_;
  auVar94 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar159._0_4_ = auVar94._0_4_ * auVar158._0_4_;
  auVar159._4_4_ = auVar94._4_4_ * auVar158._4_4_;
  auVar159._8_4_ = auVar94._8_4_ * auVar158._8_4_;
  auVar159._12_4_ = auVar94._12_4_ * auVar158._12_4_;
  auVar214 = vsubps_avx(auVar159,auVar219);
  auVar180 = vshufps_avx(auVar180,auVar180,0xc9);
  auVar220._0_4_ = auVar94._0_4_ * auVar319._0_4_;
  auVar220._4_4_ = auVar94._4_4_ * auVar319._4_4_;
  auVar220._8_4_ = auVar94._8_4_ * auVar319._8_4_;
  auVar220._12_4_ = auVar94._12_4_ * auVar319._12_4_;
  auVar94 = vdpps_avx(auVar180,auVar180,0x7f);
  auVar290 = vshufps_avx(auVar319,auVar319,0xc9);
  auVar87._0_4_ = fVar77 * auVar290._0_4_;
  auVar87._4_4_ = fVar203 * auVar290._4_4_;
  auVar87._8_4_ = fVar205 * auVar290._8_4_;
  auVar87._12_4_ = fVar236 * auVar290._12_4_;
  auVar119 = vsubps_avx(auVar220,auVar87);
  fVar200 = auVar94._0_4_;
  auVar121 = ZEXT416((uint)fVar200);
  auVar290 = vrsqrtss_avx(auVar121,auVar121);
  fVar202 = auVar290._0_4_;
  auVar319 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar290 = vdpps_avx(auVar180,auVar319,0x7f);
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar194._0_4_ = auVar94._0_4_ * auVar319._0_4_;
  auVar194._4_4_ = auVar94._4_4_ * auVar319._4_4_;
  auVar194._8_4_ = auVar94._8_4_ * auVar319._8_4_;
  auVar194._12_4_ = auVar94._12_4_ * auVar319._12_4_;
  auVar94 = vshufps_avx(auVar290,auVar290,0);
  auVar350._0_4_ = auVar94._0_4_ * auVar180._0_4_;
  auVar350._4_4_ = auVar94._4_4_ * auVar180._4_4_;
  auVar350._8_4_ = auVar94._8_4_ * auVar180._8_4_;
  auVar350._12_4_ = auVar94._12_4_ * auVar180._12_4_;
  auVar120 = vsubps_avx(auVar194,auVar350);
  auVar94 = vrcpss_avx(auVar121,auVar121);
  auVar94 = ZEXT416((uint)(auVar94._0_4_ * (2.0 - fVar200 * auVar94._0_4_)));
  auVar319 = vshufps_avx(auVar94,auVar94,0);
  auVar15 = vshufps_avx(auVar214,auVar214,0xc9);
  auVar94 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar290 = ZEXT416((uint)(fVar202 * 1.5 - fVar200 * 0.5 * fVar202 * fVar202 * fVar202));
  auVar214 = vshufps_avx(auVar290,auVar290,0);
  fVar200 = auVar180._0_4_ * auVar214._0_4_;
  fVar202 = auVar180._4_4_ * auVar214._4_4_;
  fVar204 = auVar180._8_4_ * auVar214._8_4_;
  fVar207 = auVar180._12_4_ * auVar214._12_4_;
  fVar235 = auVar94._0_4_;
  auVar121 = ZEXT416((uint)fVar235);
  auVar290 = vrsqrtss_avx(auVar121,auVar121);
  fVar237 = auVar290._0_4_;
  auVar180 = vshufps_avx(auVar119,auVar119,0xc9);
  auVar290 = vdpps_avx(auVar15,auVar180,0x7f);
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar88._0_4_ = auVar94._0_4_ * auVar180._0_4_;
  auVar88._4_4_ = auVar94._4_4_ * auVar180._4_4_;
  auVar88._8_4_ = auVar94._8_4_ * auVar180._8_4_;
  auVar88._12_4_ = auVar94._12_4_ * auVar180._12_4_;
  auVar94 = vshufps_avx(auVar290,auVar290,0);
  auVar351._0_4_ = auVar94._0_4_ * auVar15._0_4_;
  auVar351._4_4_ = auVar94._4_4_ * auVar15._4_4_;
  auVar351._8_4_ = auVar94._8_4_ * auVar15._8_4_;
  auVar351._12_4_ = auVar94._12_4_ * auVar15._12_4_;
  auVar119 = vsubps_avx(auVar88,auVar351);
  auVar94 = vrcpss_avx(auVar121,auVar121);
  auVar94 = ZEXT416((uint)(auVar94._0_4_ * (2.0 - fVar235 * auVar94._0_4_)));
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar290 = ZEXT416((uint)(fVar237 * 1.5 - fVar235 * 0.5 * fVar237 * fVar237 * fVar237));
  auVar290 = vshufps_avx(auVar290,auVar290,0);
  fVar235 = auVar15._0_4_ * auVar290._0_4_;
  fVar237 = auVar15._4_4_ * auVar290._4_4_;
  fVar239 = auVar15._8_4_ * auVar290._8_4_;
  fVar241 = auVar15._12_4_ * auVar290._12_4_;
  auVar180 = vshufps_avx(auVar166,auVar166,0xff);
  auVar15 = vshufps_avx(_local_6c0,_local_6c0,0xff);
  auVar126._0_4_ = auVar15._0_4_ * fVar200;
  auVar126._4_4_ = auVar15._4_4_ * fVar202;
  auVar126._8_4_ = auVar15._8_4_ * fVar204;
  auVar126._12_4_ = auVar15._12_4_ * fVar207;
  auVar160._0_4_ =
       auVar180._0_4_ * fVar200 + auVar15._0_4_ * auVar214._0_4_ * auVar120._0_4_ * auVar319._0_4_;
  auVar160._4_4_ =
       auVar180._4_4_ * fVar202 + auVar15._4_4_ * auVar214._4_4_ * auVar120._4_4_ * auVar319._4_4_;
  auVar160._8_4_ =
       auVar180._8_4_ * fVar204 + auVar15._8_4_ * auVar214._8_4_ * auVar120._8_4_ * auVar319._8_4_;
  auVar160._12_4_ =
       auVar180._12_4_ * fVar207 +
       auVar15._12_4_ * auVar214._12_4_ * auVar120._12_4_ * auVar319._12_4_;
  auVar15 = vsubps_avx(_local_6c0,auVar126);
  local_6c0._0_4_ = (float)local_6c0._0_4_ + auVar126._0_4_;
  local_6c0._4_4_ = (float)local_6c0._4_4_ + auVar126._4_4_;
  fStack_6b8 = fStack_6b8 + auVar126._8_4_;
  fStack_6b4 = fStack_6b4 + auVar126._12_4_;
  auVar214 = vsubps_avx(auVar166,auVar160);
  auVar180 = vshufps_avx(auVar16,auVar16,0xff);
  auVar319 = vshufps_avx(auVar339,auVar339,0xff);
  auVar221._0_4_ = auVar319._0_4_ * fVar235;
  auVar221._4_4_ = auVar319._4_4_ * fVar237;
  auVar221._8_4_ = auVar319._8_4_ * fVar239;
  auVar221._12_4_ = auVar319._12_4_ * fVar241;
  auVar161._0_4_ =
       auVar180._0_4_ * fVar235 + auVar319._0_4_ * auVar290._0_4_ * auVar119._0_4_ * auVar94._0_4_;
  auVar161._4_4_ =
       auVar180._4_4_ * fVar237 + auVar319._4_4_ * auVar290._4_4_ * auVar119._4_4_ * auVar94._4_4_;
  auVar161._8_4_ =
       auVar180._8_4_ * fVar239 + auVar319._8_4_ * auVar290._8_4_ * auVar119._8_4_ * auVar94._8_4_;
  auVar161._12_4_ =
       auVar180._12_4_ * fVar241 +
       auVar319._12_4_ * auVar290._12_4_ * auVar119._12_4_ * auVar94._12_4_;
  auVar180 = vsubps_avx(auVar339,auVar221);
  auVar352._0_4_ = auVar339._0_4_ + auVar221._0_4_;
  auVar352._4_4_ = auVar339._4_4_ + auVar221._4_4_;
  auVar352._8_4_ = auVar339._8_4_ + auVar221._8_4_;
  auVar352._12_4_ = auVar339._12_4_ + auVar221._12_4_;
  auVar319 = vsubps_avx(auVar16,auVar161);
  local_620 = auVar142._0_4_;
  fStack_61c = auVar142._4_4_;
  fStack_618 = auVar142._8_4_;
  fStack_614 = auVar142._12_4_;
  local_600 = auVar270._0_4_;
  fStack_5fc = auVar270._4_4_;
  fStack_5f8 = auVar270._8_4_;
  fStack_5f4 = auVar270._12_4_;
  auVar94 = vshufps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),0);
  auVar290 = vshufps_avx(ZEXT416((uint)(1.0 - fVar185)),ZEXT416((uint)(1.0 - fVar185)),0);
  fVar207 = auVar94._0_4_;
  fVar235 = auVar94._4_4_;
  fVar237 = auVar94._8_4_;
  fVar239 = auVar94._12_4_;
  fVar185 = auVar290._0_4_;
  fVar200 = auVar290._4_4_;
  fVar202 = auVar290._8_4_;
  fVar204 = auVar290._12_4_;
  local_4c0._0_4_ = fVar185 * local_600 + fVar207 * auVar15._0_4_;
  local_4c0._4_4_ = fVar200 * fStack_5fc + fVar235 * auVar15._4_4_;
  fStack_4b8 = fVar202 * fStack_5f8 + fVar237 * auVar15._8_4_;
  fStack_4b4 = fVar204 * fStack_5f4 + fVar239 * auVar15._12_4_;
  fVar76 = (local_600 + local_620 * 0.33333334) * fVar185 +
           (auVar15._0_4_ + auVar214._0_4_ * 0.33333334) * fVar207;
  fVar201 = (fStack_5fc + fStack_61c * 0.33333334) * fVar200 +
            (auVar15._4_4_ + auVar214._4_4_ * 0.33333334) * fVar235;
  fVar208 = (fStack_5f8 + fStack_618 * 0.33333334) * fVar202 +
            (auVar15._8_4_ + auVar214._8_4_ * 0.33333334) * fVar237;
  fVar240 = (fStack_5f4 + fStack_614 * 0.33333334) * fVar204 +
            (auVar15._12_4_ + auVar214._12_4_ * 0.33333334) * fVar239;
  local_680 = auVar130._0_4_;
  fStack_67c = auVar130._4_4_;
  fStack_678 = auVar130._8_4_;
  fStack_674 = auVar130._12_4_;
  auVar246._0_4_ = local_680 * 0.33333334;
  auVar246._4_4_ = fStack_67c * 0.33333334;
  auVar246._8_4_ = fStack_678 * 0.33333334;
  auVar246._12_4_ = fStack_674 * 0.33333334;
  auVar94 = vsubps_avx(auVar131,auVar246);
  auVar291._0_4_ = (fVar282 + auVar84._0_4_) * 0.33333334;
  auVar291._4_4_ = (fVar283 + auVar84._4_4_) * 0.33333334;
  auVar291._8_4_ = (fVar299 + auVar84._8_4_) * 0.33333334;
  auVar291._12_4_ = (fVar300 + auVar84._12_4_) * 0.33333334;
  auVar290 = vsubps_avx(_local_6b0,auVar291);
  auVar222._0_4_ = auVar319._0_4_ * 0.33333334;
  auVar222._4_4_ = auVar319._4_4_ * 0.33333334;
  auVar222._8_4_ = auVar319._8_4_ * 0.33333334;
  auVar222._12_4_ = auVar319._12_4_ * 0.33333334;
  auVar319 = vsubps_avx(auVar180,auVar222);
  auVar162._0_4_ = (fVar77 + auVar161._0_4_) * 0.33333334;
  auVar162._4_4_ = (fVar203 + auVar161._4_4_) * 0.33333334;
  auVar162._8_4_ = (fVar205 + auVar161._8_4_) * 0.33333334;
  auVar162._12_4_ = (fVar236 + auVar161._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar352,auVar162);
  local_4d0._0_4_ = fVar185 * auVar94._0_4_ + fVar207 * auVar319._0_4_;
  local_4d0._4_4_ = fVar200 * auVar94._4_4_ + fVar235 * auVar319._4_4_;
  fStack_4c8 = fVar202 * auVar94._8_4_ + fVar237 * auVar319._8_4_;
  fStack_4c4 = fVar204 * auVar94._12_4_ + fVar239 * auVar319._12_4_;
  local_4e0._0_4_ = auVar180._0_4_ * fVar207 + auVar131._0_4_ * fVar185;
  local_4e0._4_4_ = auVar180._4_4_ * fVar235 + auVar131._4_4_ * fVar200;
  fStack_4d8 = auVar180._8_4_ * fVar237 + auVar131._8_4_ * fVar202;
  fStack_4d4 = auVar180._12_4_ * fVar239 + auVar131._12_4_ * fVar204;
  local_4f0._0_4_ = fVar185 * (float)local_700._0_4_ + fVar207 * (float)local_6c0._0_4_;
  local_4f0._4_4_ = fVar200 * (float)local_700._4_4_ + fVar235 * (float)local_6c0._4_4_;
  fStack_4e8 = fVar202 * fStack_6f8 + fVar237 * fStack_6b8;
  fStack_4e4 = fVar204 * fStack_6f4 + fVar239 * fStack_6b4;
  fVar77 = fVar185 * ((float)local_700._0_4_ + (fVar117 + auVar215._0_4_) * 0.33333334) +
           ((fVar255 + auVar160._0_4_) * 0.33333334 + (float)local_6c0._0_4_) * fVar207;
  fVar203 = fVar200 * ((float)local_700._4_4_ + (fVar118 + auVar215._4_4_) * 0.33333334) +
            ((fVar256 + auVar160._4_4_) * 0.33333334 + (float)local_6c0._4_4_) * fVar235;
  fVar236 = fVar202 * (fStack_6f8 + (fVar206 + auVar215._8_4_) * 0.33333334) +
            ((fVar257 + auVar160._8_4_) * 0.33333334 + fStack_6b8) * fVar237;
  fVar113 = fVar204 * (fStack_6f4 + (fVar258 + auVar215._12_4_) * 0.33333334) +
            ((fVar186 + auVar160._12_4_) * 0.33333334 + fStack_6b4) * fVar239;
  fVar186 = auVar290._0_4_ * fVar185 + fVar207 * auVar15._0_4_;
  fVar205 = auVar290._4_4_ * fVar200 + fVar235 * auVar15._4_4_;
  fVar238 = auVar290._8_4_ * fVar202 + fVar237 * auVar15._8_4_;
  fVar114 = auVar290._12_4_ * fVar204 + fVar239 * auVar15._12_4_;
  local_500 = (float)local_6b0._0_4_ * fVar185 + auVar352._0_4_ * fVar207;
  fStack_4fc = (float)local_6b0._4_4_ * fVar200 + auVar352._4_4_ * fVar235;
  fStack_4f8 = fStack_6a8 * fVar202 + auVar352._8_4_ * fVar237;
  fStack_4f4 = fStack_6a4 * fVar204 + auVar352._12_4_ * fVar239;
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_3a0 = vsubps_avx(_local_4c0,auVar94);
  auVar180 = vmovsldup_avx(local_3a0);
  auVar290 = vmovshdup_avx(local_3a0);
  auVar319 = vshufps_avx(local_3a0,local_3a0,0xaa);
  fVar185 = pre->ray_space[k].vx.field_0.m128[0];
  fVar200 = pre->ray_space[k].vx.field_0.m128[1];
  fVar202 = pre->ray_space[k].vx.field_0.m128[2];
  fVar204 = pre->ray_space[k].vx.field_0.m128[3];
  fVar207 = pre->ray_space[k].vy.field_0.m128[0];
  fVar235 = pre->ray_space[k].vy.field_0.m128[1];
  fVar237 = pre->ray_space[k].vy.field_0.m128[2];
  fVar239 = pre->ray_space[k].vy.field_0.m128[3];
  fVar241 = pre->ray_space[k].vz.field_0.m128[0];
  fVar255 = pre->ray_space[k].vz.field_0.m128[1];
  fVar256 = pre->ray_space[k].vz.field_0.m128[2];
  fVar257 = pre->ray_space[k].vz.field_0.m128[3];
  auVar360._0_4_ = fVar185 * auVar180._0_4_ + fVar207 * auVar290._0_4_ + fVar241 * auVar319._0_4_;
  auVar360._4_4_ = fVar200 * auVar180._4_4_ + fVar235 * auVar290._4_4_ + fVar255 * auVar319._4_4_;
  auVar360._8_4_ = fVar202 * auVar180._8_4_ + fVar237 * auVar290._8_4_ + fVar256 * auVar319._8_4_;
  auVar360._12_4_ =
       fVar204 * auVar180._12_4_ + fVar239 * auVar290._12_4_ + fVar257 * auVar319._12_4_;
  auVar61._4_4_ = fVar201;
  auVar61._0_4_ = fVar76;
  auVar61._8_4_ = fVar208;
  auVar61._12_4_ = fVar240;
  local_3b0 = vsubps_avx(auVar61,auVar94);
  auVar319 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar290 = vmovshdup_avx(local_3b0);
  auVar180 = vmovsldup_avx(local_3b0);
  auVar353._0_4_ = fVar185 * auVar180._0_4_ + fVar207 * auVar290._0_4_ + fVar241 * auVar319._0_4_;
  auVar353._4_4_ = fVar200 * auVar180._4_4_ + fVar235 * auVar290._4_4_ + fVar255 * auVar319._4_4_;
  auVar353._8_4_ = fVar202 * auVar180._8_4_ + fVar237 * auVar290._8_4_ + fVar256 * auVar319._8_4_;
  auVar353._12_4_ =
       fVar204 * auVar180._12_4_ + fVar239 * auVar290._12_4_ + fVar257 * auVar319._12_4_;
  local_3c0 = vsubps_avx(_local_4d0,auVar94);
  auVar319 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar290 = vmovshdup_avx(local_3c0);
  auVar180 = vmovsldup_avx(local_3c0);
  auVar340._0_4_ = fVar185 * auVar180._0_4_ + fVar207 * auVar290._0_4_ + fVar241 * auVar319._0_4_;
  auVar340._4_4_ = fVar200 * auVar180._4_4_ + fVar235 * auVar290._4_4_ + fVar255 * auVar319._4_4_;
  auVar340._8_4_ = fVar202 * auVar180._8_4_ + fVar237 * auVar290._8_4_ + fVar256 * auVar319._8_4_;
  auVar340._12_4_ =
       fVar204 * auVar180._12_4_ + fVar239 * auVar290._12_4_ + fVar257 * auVar319._12_4_;
  local_3d0 = vsubps_avx(_local_4e0,auVar94);
  auVar319 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar290 = vmovshdup_avx(local_3d0);
  auVar180 = vmovsldup_avx(local_3d0);
  auVar127._0_4_ = auVar180._0_4_ * fVar185 + auVar290._0_4_ * fVar207 + fVar241 * auVar319._0_4_;
  auVar127._4_4_ = auVar180._4_4_ * fVar200 + auVar290._4_4_ * fVar235 + fVar255 * auVar319._4_4_;
  auVar127._8_4_ = auVar180._8_4_ * fVar202 + auVar290._8_4_ * fVar237 + fVar256 * auVar319._8_4_;
  auVar127._12_4_ =
       auVar180._12_4_ * fVar204 + auVar290._12_4_ * fVar239 + fVar257 * auVar319._12_4_;
  local_3e0 = vsubps_avx(_local_4f0,auVar94);
  auVar319 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar290 = vmovshdup_avx(local_3e0);
  auVar180 = vmovsldup_avx(local_3e0);
  auVar292._0_4_ = auVar180._0_4_ * fVar185 + auVar290._0_4_ * fVar207 + auVar319._0_4_ * fVar241;
  auVar292._4_4_ = auVar180._4_4_ * fVar200 + auVar290._4_4_ * fVar235 + auVar319._4_4_ * fVar255;
  auVar292._8_4_ = auVar180._8_4_ * fVar202 + auVar290._8_4_ * fVar237 + auVar319._8_4_ * fVar256;
  auVar292._12_4_ =
       auVar180._12_4_ * fVar204 + auVar290._12_4_ * fVar239 + auVar319._12_4_ * fVar257;
  auVar59._4_4_ = fVar203;
  auVar59._0_4_ = fVar77;
  auVar59._8_4_ = fVar236;
  auVar59._12_4_ = fVar113;
  local_3f0 = vsubps_avx(auVar59,auVar94);
  auVar319 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar290 = vmovshdup_avx(local_3f0);
  auVar180 = vmovsldup_avx(local_3f0);
  auVar307._0_4_ = auVar180._0_4_ * fVar185 + auVar290._0_4_ * fVar207 + auVar319._0_4_ * fVar241;
  auVar307._4_4_ = auVar180._4_4_ * fVar200 + auVar290._4_4_ * fVar235 + auVar319._4_4_ * fVar255;
  auVar307._8_4_ = auVar180._8_4_ * fVar202 + auVar290._8_4_ * fVar237 + auVar319._8_4_ * fVar256;
  auVar307._12_4_ =
       auVar180._12_4_ * fVar204 + auVar290._12_4_ * fVar239 + auVar319._12_4_ * fVar257;
  auVar57._4_4_ = fVar205;
  auVar57._0_4_ = fVar186;
  auVar57._8_4_ = fVar238;
  auVar57._12_4_ = fVar114;
  local_400 = vsubps_avx(auVar57,auVar94);
  auVar319 = vshufps_avx(local_400,local_400,0xaa);
  auVar290 = vmovshdup_avx(local_400);
  auVar180 = vmovsldup_avx(local_400);
  auVar321._0_4_ = auVar180._0_4_ * fVar185 + auVar290._0_4_ * fVar207 + auVar319._0_4_ * fVar241;
  auVar321._4_4_ = auVar180._4_4_ * fVar200 + auVar290._4_4_ * fVar235 + auVar319._4_4_ * fVar255;
  auVar321._8_4_ = auVar180._8_4_ * fVar202 + auVar290._8_4_ * fVar237 + auVar319._8_4_ * fVar256;
  auVar321._12_4_ =
       auVar180._12_4_ * fVar204 + auVar290._12_4_ * fVar239 + auVar319._12_4_ * fVar257;
  auVar63._4_4_ = fStack_4fc;
  auVar63._0_4_ = local_500;
  auVar63._8_4_ = fStack_4f8;
  auVar63._12_4_ = fStack_4f4;
  local_410 = vsubps_avx(auVar63,auVar94);
  auVar180 = vshufps_avx(local_410,local_410,0xaa);
  auVar94 = vmovshdup_avx(local_410);
  auVar290 = vmovsldup_avx(local_410);
  auVar89._0_4_ = fVar185 * auVar290._0_4_ + fVar207 * auVar94._0_4_ + fVar241 * auVar180._0_4_;
  auVar89._4_4_ = fVar200 * auVar290._4_4_ + fVar235 * auVar94._4_4_ + fVar255 * auVar180._4_4_;
  auVar89._8_4_ = fVar202 * auVar290._8_4_ + fVar237 * auVar94._8_4_ + fVar256 * auVar180._8_4_;
  auVar89._12_4_ = fVar204 * auVar290._12_4_ + fVar239 * auVar94._12_4_ + fVar257 * auVar180._12_4_;
  auVar319 = vmovlhps_avx(auVar360,auVar292);
  auVar15 = vmovlhps_avx(auVar353,auVar307);
  auVar214 = vmovlhps_avx(auVar340,auVar321);
  _local_380 = vmovlhps_avx(auVar127,auVar89);
  auVar94 = vminps_avx(auVar319,auVar15);
  auVar290 = vminps_avx(auVar214,_local_380);
  auVar180 = vminps_avx(auVar94,auVar290);
  auVar94 = vmaxps_avx(auVar319,auVar15);
  auVar290 = vmaxps_avx(auVar214,_local_380);
  auVar94 = vmaxps_avx(auVar94,auVar290);
  auVar290 = vshufpd_avx(auVar180,auVar180,3);
  auVar180 = vminps_avx(auVar180,auVar290);
  auVar290 = vshufpd_avx(auVar94,auVar94,3);
  auVar290 = vmaxps_avx(auVar94,auVar290);
  auVar264._8_4_ = 0x7fffffff;
  auVar264._0_8_ = 0x7fffffff7fffffff;
  auVar264._12_4_ = 0x7fffffff;
  auVar94 = vandps_avx(auVar180,auVar264);
  auVar290 = vandps_avx(auVar290,auVar264);
  auVar94 = vmaxps_avx(auVar94,auVar290);
  auVar290 = vmovshdup_avx(auVar94);
  auVar94 = vmaxss_avx(auVar290,auVar94);
  fVar185 = auVar94._0_4_ * 9.536743e-07;
  local_390 = ZEXT416((uint)fVar185);
  auVar94 = vshufps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),0);
  local_1c0._16_16_ = auVar94;
  local_1c0._0_16_ = auVar94;
  auVar90._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
  auVar90._8_4_ = auVar94._8_4_ ^ 0x80000000;
  auVar90._12_4_ = auVar94._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar90;
  local_1e0._0_16_ = auVar90;
  auVar94 = vpshufd_avx(ZEXT416(uVar65),0);
  local_300._16_16_ = auVar94;
  local_300._0_16_ = auVar94;
  auVar94 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar68 * 4 + 6)),0);
  local_320._16_16_ = auVar94;
  local_320._0_16_ = auVar94;
  bVar75 = false;
  uVar69 = 0;
  fVar185 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar15,auVar319);
  _local_360 = vsubps_avx(auVar214,auVar15);
  _local_370 = vsubps_avx(_local_380,auVar214);
  _local_440 = vsubps_avx(_local_4f0,_local_4c0);
  auVar60._4_4_ = fVar203;
  auVar60._0_4_ = fVar77;
  auVar60._8_4_ = fVar236;
  auVar60._12_4_ = fVar113;
  auVar62._4_4_ = fVar201;
  auVar62._0_4_ = fVar76;
  auVar62._8_4_ = fVar208;
  auVar62._12_4_ = fVar240;
  _local_450 = vsubps_avx(auVar60,auVar62);
  auVar58._4_4_ = fVar205;
  auVar58._0_4_ = fVar186;
  auVar58._8_4_ = fVar238;
  auVar58._12_4_ = fVar114;
  _local_460 = vsubps_avx(auVar58,_local_4d0);
  _local_470 = vsubps_avx(auVar63,_local_4e0);
  auVar334 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar367 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_008f0067:
  local_420 = auVar367._0_16_;
  auVar120 = auVar334._0_16_;
  auVar94 = vshufps_avx(auVar120,auVar120,0x50);
  auVar361._8_4_ = 0x3f800000;
  auVar361._0_8_ = 0x3f8000003f800000;
  auVar361._12_4_ = 0x3f800000;
  auVar364._16_4_ = 0x3f800000;
  auVar364._0_16_ = auVar361;
  auVar364._20_4_ = 0x3f800000;
  auVar364._24_4_ = 0x3f800000;
  auVar364._28_4_ = 0x3f800000;
  auVar290 = vsubps_avx(auVar361,auVar94);
  fVar200 = auVar94._0_4_;
  fVar202 = auVar94._4_4_;
  fVar204 = auVar94._8_4_;
  fVar207 = auVar94._12_4_;
  fVar235 = auVar290._0_4_;
  fVar237 = auVar290._4_4_;
  fVar239 = auVar290._8_4_;
  fVar241 = auVar290._12_4_;
  auVar195._0_4_ = auVar292._0_4_ * fVar200 + fVar235 * auVar360._0_4_;
  auVar195._4_4_ = auVar292._4_4_ * fVar202 + fVar237 * auVar360._4_4_;
  auVar195._8_4_ = auVar292._0_4_ * fVar204 + fVar239 * auVar360._0_4_;
  auVar195._12_4_ = auVar292._4_4_ * fVar207 + fVar241 * auVar360._4_4_;
  auVar163._0_4_ = auVar307._0_4_ * fVar200 + auVar353._0_4_ * fVar235;
  auVar163._4_4_ = auVar307._4_4_ * fVar202 + auVar353._4_4_ * fVar237;
  auVar163._8_4_ = auVar307._0_4_ * fVar204 + auVar353._0_4_ * fVar239;
  auVar163._12_4_ = auVar307._4_4_ * fVar207 + auVar353._4_4_ * fVar241;
  auVar279._0_4_ = auVar321._0_4_ * fVar200 + auVar340._0_4_ * fVar235;
  auVar279._4_4_ = auVar321._4_4_ * fVar202 + auVar340._4_4_ * fVar237;
  auVar279._8_4_ = auVar321._0_4_ * fVar204 + auVar340._0_4_ * fVar239;
  auVar279._12_4_ = auVar321._4_4_ * fVar207 + auVar340._4_4_ * fVar241;
  auVar223._0_4_ = auVar89._0_4_ * fVar200 + auVar127._0_4_ * fVar235;
  auVar223._4_4_ = auVar89._4_4_ * fVar202 + auVar127._4_4_ * fVar237;
  auVar223._8_4_ = auVar89._0_4_ * fVar204 + auVar127._0_4_ * fVar239;
  auVar223._12_4_ = auVar89._4_4_ * fVar207 + auVar127._4_4_ * fVar241;
  auVar94 = vmovshdup_avx(local_420);
  auVar290 = vshufps_avx(local_420,local_420,0);
  auVar310._16_16_ = auVar290;
  auVar310._0_16_ = auVar290;
  auVar180 = vshufps_avx(local_420,local_420,0x55);
  auVar107._16_16_ = auVar180;
  auVar107._0_16_ = auVar180;
  auVar106 = vsubps_avx(auVar107,auVar310);
  auVar180 = vshufps_avx(auVar195,auVar195,0);
  auVar142 = vshufps_avx(auVar195,auVar195,0x55);
  auVar130 = vshufps_avx(auVar163,auVar163,0);
  auVar166 = vshufps_avx(auVar163,auVar163,0x55);
  auVar131 = vshufps_avx(auVar279,auVar279,0);
  auVar270 = vshufps_avx(auVar279,auVar279,0x55);
  auVar16 = vshufps_avx(auVar223,auVar223,0);
  auVar119 = vshufps_avx(auVar223,auVar223,0x55);
  auVar94 = ZEXT416((uint)((auVar94._0_4_ - auVar367._0_4_) * 0.04761905));
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar326._0_4_ = auVar290._0_4_ + auVar106._0_4_ * 0.0;
  auVar326._4_4_ = auVar290._4_4_ + auVar106._4_4_ * 0.14285715;
  auVar326._8_4_ = auVar290._8_4_ + auVar106._8_4_ * 0.2857143;
  auVar326._12_4_ = auVar290._12_4_ + auVar106._12_4_ * 0.42857146;
  auVar326._16_4_ = auVar290._0_4_ + auVar106._16_4_ * 0.5714286;
  auVar326._20_4_ = auVar290._4_4_ + auVar106._20_4_ * 0.71428573;
  auVar326._24_4_ = auVar290._8_4_ + auVar106._24_4_ * 0.8571429;
  auVar326._28_4_ = auVar290._12_4_ + auVar106._28_4_;
  auVar17 = vsubps_avx(auVar364,auVar326);
  fVar200 = auVar130._0_4_;
  fVar204 = auVar130._4_4_;
  fVar235 = auVar130._8_4_;
  fVar239 = auVar130._12_4_;
  fVar304 = auVar17._0_4_;
  fVar312 = auVar17._4_4_;
  fVar313 = auVar17._8_4_;
  fVar314 = auVar17._12_4_;
  fVar315 = auVar17._16_4_;
  fVar316 = auVar17._20_4_;
  fVar317 = auVar17._24_4_;
  fVar300 = auVar166._0_4_;
  fVar301 = auVar166._4_4_;
  fVar302 = auVar166._8_4_;
  fVar303 = auVar166._12_4_;
  fVar355 = auVar142._12_4_ + 1.0;
  fVar258 = auVar131._0_4_;
  fVar282 = auVar131._4_4_;
  fVar283 = auVar131._8_4_;
  fVar299 = auVar131._12_4_;
  fVar255 = fVar258 * auVar326._0_4_ + fVar304 * fVar200;
  fVar256 = fVar282 * auVar326._4_4_ + fVar312 * fVar204;
  fVar257 = fVar283 * auVar326._8_4_ + fVar313 * fVar235;
  fVar115 = fVar299 * auVar326._12_4_ + fVar314 * fVar239;
  fVar116 = fVar258 * auVar326._16_4_ + fVar315 * fVar200;
  fVar117 = fVar282 * auVar326._20_4_ + fVar316 * fVar204;
  fVar118 = fVar283 * auVar326._24_4_ + fVar317 * fVar235;
  fVar202 = auVar270._0_4_;
  fVar207 = auVar270._4_4_;
  fVar237 = auVar270._8_4_;
  fVar241 = auVar270._12_4_;
  fVar335 = fVar300 * fVar304 + auVar326._0_4_ * fVar202;
  fVar342 = fVar301 * fVar312 + auVar326._4_4_ * fVar207;
  fVar343 = fVar302 * fVar313 + auVar326._8_4_ * fVar237;
  fVar344 = fVar303 * fVar314 + auVar326._12_4_ * fVar241;
  fVar345 = fVar300 * fVar315 + auVar326._16_4_ * fVar202;
  fVar346 = fVar301 * fVar316 + auVar326._20_4_ * fVar207;
  fVar347 = fVar302 * fVar317 + auVar326._24_4_ * fVar237;
  fVar348 = fVar303 + fVar239;
  auVar290 = vshufps_avx(auVar195,auVar195,0xaa);
  auVar130 = vshufps_avx(auVar195,auVar195,0xff);
  fVar206 = fVar299 + 0.0;
  auVar166 = vshufps_avx(auVar163,auVar163,0xaa);
  auVar131 = vshufps_avx(auVar163,auVar163,0xff);
  auVar233._0_4_ =
       fVar304 * (auVar326._0_4_ * fVar200 + fVar304 * auVar180._0_4_) + auVar326._0_4_ * fVar255;
  auVar233._4_4_ =
       fVar312 * (auVar326._4_4_ * fVar204 + fVar312 * auVar180._4_4_) + auVar326._4_4_ * fVar256;
  auVar233._8_4_ =
       fVar313 * (auVar326._8_4_ * fVar235 + fVar313 * auVar180._8_4_) + auVar326._8_4_ * fVar257;
  auVar233._12_4_ =
       fVar314 * (auVar326._12_4_ * fVar239 + fVar314 * auVar180._12_4_) + auVar326._12_4_ * fVar115
  ;
  auVar233._16_4_ =
       fVar315 * (auVar326._16_4_ * fVar200 + fVar315 * auVar180._0_4_) + auVar326._16_4_ * fVar116;
  auVar233._20_4_ =
       fVar316 * (auVar326._20_4_ * fVar204 + fVar316 * auVar180._4_4_) + auVar326._20_4_ * fVar117;
  auVar233._24_4_ =
       fVar317 * (auVar326._24_4_ * fVar235 + fVar317 * auVar180._8_4_) + auVar326._24_4_ * fVar118;
  auVar233._28_4_ = auVar180._12_4_ + 1.0 + fVar241;
  auVar253._0_4_ =
       fVar304 * (fVar300 * auVar326._0_4_ + auVar142._0_4_ * fVar304) + auVar326._0_4_ * fVar335;
  auVar253._4_4_ =
       fVar312 * (fVar301 * auVar326._4_4_ + auVar142._4_4_ * fVar312) + auVar326._4_4_ * fVar342;
  auVar253._8_4_ =
       fVar313 * (fVar302 * auVar326._8_4_ + auVar142._8_4_ * fVar313) + auVar326._8_4_ * fVar343;
  auVar253._12_4_ =
       fVar314 * (fVar303 * auVar326._12_4_ + auVar142._12_4_ * fVar314) + auVar326._12_4_ * fVar344
  ;
  auVar253._16_4_ =
       fVar315 * (fVar300 * auVar326._16_4_ + auVar142._0_4_ * fVar315) + auVar326._16_4_ * fVar345;
  auVar253._20_4_ =
       fVar316 * (fVar301 * auVar326._20_4_ + auVar142._4_4_ * fVar316) + auVar326._20_4_ * fVar346;
  auVar253._24_4_ =
       fVar317 * (fVar302 * auVar326._24_4_ + auVar142._8_4_ * fVar317) + auVar326._24_4_ * fVar347;
  auVar253._28_4_ = auVar119._12_4_ + fVar241;
  auVar108._0_4_ =
       fVar304 * fVar255 + auVar326._0_4_ * (fVar258 * fVar304 + auVar16._0_4_ * auVar326._0_4_);
  auVar108._4_4_ =
       fVar312 * fVar256 + auVar326._4_4_ * (fVar282 * fVar312 + auVar16._4_4_ * auVar326._4_4_);
  auVar108._8_4_ =
       fVar313 * fVar257 + auVar326._8_4_ * (fVar283 * fVar313 + auVar16._8_4_ * auVar326._8_4_);
  auVar108._12_4_ =
       fVar314 * fVar115 + auVar326._12_4_ * (fVar299 * fVar314 + auVar16._12_4_ * auVar326._12_4_);
  auVar108._16_4_ =
       fVar315 * fVar116 + auVar326._16_4_ * (fVar258 * fVar315 + auVar16._0_4_ * auVar326._16_4_);
  auVar108._20_4_ =
       fVar316 * fVar117 + auVar326._20_4_ * (fVar282 * fVar316 + auVar16._4_4_ * auVar326._20_4_);
  auVar108._24_4_ =
       fVar317 * fVar118 + auVar326._24_4_ * (fVar283 * fVar317 + auVar16._8_4_ * auVar326._24_4_);
  auVar108._28_4_ = fVar239 + 1.0 + fVar206;
  auVar333._0_4_ =
       fVar304 * fVar335 + auVar326._0_4_ * (auVar119._0_4_ * auVar326._0_4_ + fVar304 * fVar202);
  auVar333._4_4_ =
       fVar312 * fVar342 + auVar326._4_4_ * (auVar119._4_4_ * auVar326._4_4_ + fVar312 * fVar207);
  auVar333._8_4_ =
       fVar313 * fVar343 + auVar326._8_4_ * (auVar119._8_4_ * auVar326._8_4_ + fVar313 * fVar237);
  auVar333._12_4_ =
       fVar314 * fVar344 + auVar326._12_4_ * (auVar119._12_4_ * auVar326._12_4_ + fVar314 * fVar241)
  ;
  auVar333._16_4_ =
       fVar315 * fVar345 + auVar326._16_4_ * (auVar119._0_4_ * auVar326._16_4_ + fVar315 * fVar202);
  auVar333._20_4_ =
       fVar316 * fVar346 + auVar326._20_4_ * (auVar119._4_4_ * auVar326._20_4_ + fVar316 * fVar207);
  auVar333._24_4_ =
       fVar317 * fVar347 + auVar326._24_4_ * (auVar119._8_4_ * auVar326._24_4_ + fVar317 * fVar237);
  auVar333._28_4_ = fVar206 + fVar241 + 0.0;
  local_220._0_4_ = fVar304 * auVar233._0_4_ + auVar326._0_4_ * auVar108._0_4_;
  local_220._4_4_ = fVar312 * auVar233._4_4_ + auVar326._4_4_ * auVar108._4_4_;
  local_220._8_4_ = fVar313 * auVar233._8_4_ + auVar326._8_4_ * auVar108._8_4_;
  local_220._12_4_ = fVar314 * auVar233._12_4_ + auVar326._12_4_ * auVar108._12_4_;
  local_220._16_4_ = fVar315 * auVar233._16_4_ + auVar326._16_4_ * auVar108._16_4_;
  local_220._20_4_ = fVar316 * auVar233._20_4_ + auVar326._20_4_ * auVar108._20_4_;
  local_220._24_4_ = fVar317 * auVar233._24_4_ + auVar326._24_4_ * auVar108._24_4_;
  local_220._28_4_ = fVar348 + fVar241 + 0.0;
  auVar199._0_4_ = fVar304 * auVar253._0_4_ + auVar326._0_4_ * auVar333._0_4_;
  auVar199._4_4_ = fVar312 * auVar253._4_4_ + auVar326._4_4_ * auVar333._4_4_;
  auVar199._8_4_ = fVar313 * auVar253._8_4_ + auVar326._8_4_ * auVar333._8_4_;
  auVar199._12_4_ = fVar314 * auVar253._12_4_ + auVar326._12_4_ * auVar333._12_4_;
  auVar199._16_4_ = fVar315 * auVar253._16_4_ + auVar326._16_4_ * auVar333._16_4_;
  auVar199._20_4_ = fVar316 * auVar253._20_4_ + auVar326._20_4_ * auVar333._20_4_;
  auVar199._24_4_ = fVar317 * auVar253._24_4_ + auVar326._24_4_ * auVar333._24_4_;
  auVar199._28_4_ = fVar348 + fVar206;
  auVar18 = vsubps_avx(auVar108,auVar233);
  auVar106 = vsubps_avx(auVar333,auVar253);
  local_620 = auVar94._0_4_;
  fStack_61c = auVar94._4_4_;
  fStack_618 = auVar94._8_4_;
  fStack_614 = auVar94._12_4_;
  local_260 = local_620 * auVar18._0_4_ * 3.0;
  fStack_25c = fStack_61c * auVar18._4_4_ * 3.0;
  auVar19._4_4_ = fStack_25c;
  auVar19._0_4_ = local_260;
  fStack_258 = fStack_618 * auVar18._8_4_ * 3.0;
  auVar19._8_4_ = fStack_258;
  fStack_254 = fStack_614 * auVar18._12_4_ * 3.0;
  auVar19._12_4_ = fStack_254;
  fStack_250 = local_620 * auVar18._16_4_ * 3.0;
  auVar19._16_4_ = fStack_250;
  fStack_24c = fStack_61c * auVar18._20_4_ * 3.0;
  auVar19._20_4_ = fStack_24c;
  fStack_248 = fStack_618 * auVar18._24_4_ * 3.0;
  auVar19._24_4_ = fStack_248;
  auVar19._28_4_ = auVar18._28_4_;
  local_280 = local_620 * auVar106._0_4_ * 3.0;
  fStack_27c = fStack_61c * auVar106._4_4_ * 3.0;
  auVar20._4_4_ = fStack_27c;
  auVar20._0_4_ = local_280;
  fStack_278 = fStack_618 * auVar106._8_4_ * 3.0;
  auVar20._8_4_ = fStack_278;
  fStack_274 = fStack_614 * auVar106._12_4_ * 3.0;
  auVar20._12_4_ = fStack_274;
  fStack_270 = local_620 * auVar106._16_4_ * 3.0;
  auVar20._16_4_ = fStack_270;
  fStack_26c = fStack_61c * auVar106._20_4_ * 3.0;
  auVar20._20_4_ = fStack_26c;
  fStack_268 = fStack_618 * auVar106._24_4_ * 3.0;
  auVar20._24_4_ = fStack_268;
  auVar20._28_4_ = fVar348;
  auVar19 = vsubps_avx(local_220,auVar19);
  auVar106 = vperm2f128_avx(auVar19,auVar19,1);
  auVar106 = vshufps_avx(auVar106,auVar19,0x30);
  auVar106 = vshufps_avx(auVar19,auVar106,0x29);
  auVar20 = vsubps_avx(auVar199,auVar20);
  auVar19 = vperm2f128_avx(auVar20,auVar20,1);
  auVar19 = vshufps_avx(auVar19,auVar20,0x30);
  auVar20 = vshufps_avx(auVar20,auVar19,0x29);
  fVar346 = auVar166._0_4_;
  fVar347 = auVar166._4_4_;
  fVar368 = auVar166._8_4_;
  fVar239 = auVar290._12_4_;
  fVar282 = auVar131._0_4_;
  fVar299 = auVar131._4_4_;
  fVar335 = auVar131._8_4_;
  fVar342 = auVar131._12_4_;
  auVar94 = vshufps_avx(auVar279,auVar279,0xaa);
  fVar200 = auVar94._0_4_;
  fVar204 = auVar94._4_4_;
  fVar235 = auVar94._8_4_;
  fVar241 = auVar94._12_4_;
  fVar257 = auVar326._0_4_ * fVar200 + fVar346 * fVar304;
  fVar115 = auVar326._4_4_ * fVar204 + fVar347 * fVar312;
  fVar116 = auVar326._8_4_ * fVar235 + fVar368 * fVar313;
  fVar117 = auVar326._12_4_ * fVar241 + auVar166._12_4_ * fVar314;
  fVar118 = auVar326._16_4_ * fVar200 + fVar346 * fVar315;
  fVar206 = auVar326._20_4_ * fVar204 + fVar347 * fVar316;
  fVar258 = auVar326._24_4_ * fVar235 + fVar368 * fVar317;
  auVar94 = vshufps_avx(auVar279,auVar279,0xff);
  fVar202 = auVar94._0_4_;
  fVar207 = auVar94._4_4_;
  fVar237 = auVar94._8_4_;
  fVar255 = auVar94._12_4_;
  fVar283 = auVar326._0_4_ * fVar202 + fVar282 * fVar304;
  fVar300 = auVar326._4_4_ * fVar207 + fVar299 * fVar312;
  fVar301 = auVar326._8_4_ * fVar237 + fVar335 * fVar313;
  fVar302 = auVar326._12_4_ * fVar255 + fVar342 * fVar314;
  fVar343 = auVar326._16_4_ * fVar202 + fVar282 * fVar315;
  fVar303 = auVar326._20_4_ * fVar207 + fVar299 * fVar316;
  fVar344 = auVar326._24_4_ * fVar237 + fVar335 * fVar317;
  auVar94 = vshufps_avx(auVar223,auVar223,0xaa);
  fVar345 = auVar94._12_4_ + fVar241;
  auVar180 = vshufps_avx(auVar223,auVar223,0xff);
  fVar256 = auVar180._12_4_;
  auVar109._0_4_ =
       fVar304 * (fVar346 * auVar326._0_4_ + fVar304 * auVar290._0_4_) + auVar326._0_4_ * fVar257;
  auVar109._4_4_ =
       fVar312 * (fVar347 * auVar326._4_4_ + fVar312 * auVar290._4_4_) + auVar326._4_4_ * fVar115;
  auVar109._8_4_ =
       fVar313 * (fVar368 * auVar326._8_4_ + fVar313 * auVar290._8_4_) + auVar326._8_4_ * fVar116;
  auVar109._12_4_ =
       fVar314 * (auVar166._12_4_ * auVar326._12_4_ + fVar314 * fVar239) + auVar326._12_4_ * fVar117
  ;
  auVar109._16_4_ =
       fVar315 * (fVar346 * auVar326._16_4_ + fVar315 * auVar290._0_4_) + auVar326._16_4_ * fVar118;
  auVar109._20_4_ =
       fVar316 * (fVar347 * auVar326._20_4_ + fVar316 * auVar290._4_4_) + auVar326._20_4_ * fVar206;
  auVar109._24_4_ =
       fVar317 * (fVar368 * auVar326._24_4_ + fVar317 * auVar290._8_4_) + auVar326._24_4_ * fVar258;
  auVar109._28_4_ = auVar20._28_4_ + fVar239 + fVar256;
  auVar147._0_4_ =
       fVar304 * (fVar282 * auVar326._0_4_ + auVar130._0_4_ * fVar304) + auVar326._0_4_ * fVar283;
  auVar147._4_4_ =
       fVar312 * (fVar299 * auVar326._4_4_ + auVar130._4_4_ * fVar312) + auVar326._4_4_ * fVar300;
  auVar147._8_4_ =
       fVar313 * (fVar335 * auVar326._8_4_ + auVar130._8_4_ * fVar313) + auVar326._8_4_ * fVar301;
  auVar147._12_4_ =
       fVar314 * (fVar342 * auVar326._12_4_ + auVar130._12_4_ * fVar314) + auVar326._12_4_ * fVar302
  ;
  auVar147._16_4_ =
       fVar315 * (fVar282 * auVar326._16_4_ + auVar130._0_4_ * fVar315) + auVar326._16_4_ * fVar343;
  auVar147._20_4_ =
       fVar316 * (fVar299 * auVar326._20_4_ + auVar130._4_4_ * fVar316) + auVar326._20_4_ * fVar303;
  auVar147._24_4_ =
       fVar317 * (fVar335 * auVar326._24_4_ + auVar130._8_4_ * fVar317) + auVar326._24_4_ * fVar344;
  auVar147._28_4_ = fVar239 + auVar19._28_4_ + fVar256;
  auVar19 = vperm2f128_avx(local_220,local_220,1);
  auVar19 = vshufps_avx(auVar19,local_220,0x30);
  auVar107 = vshufps_avx(local_220,auVar19,0x29);
  auVar254._0_4_ =
       auVar326._0_4_ * (auVar94._0_4_ * auVar326._0_4_ + fVar304 * fVar200) + fVar304 * fVar257;
  auVar254._4_4_ =
       auVar326._4_4_ * (auVar94._4_4_ * auVar326._4_4_ + fVar312 * fVar204) + fVar312 * fVar115;
  auVar254._8_4_ =
       auVar326._8_4_ * (auVar94._8_4_ * auVar326._8_4_ + fVar313 * fVar235) + fVar313 * fVar116;
  auVar254._12_4_ =
       auVar326._12_4_ * (auVar94._12_4_ * auVar326._12_4_ + fVar314 * fVar241) + fVar314 * fVar117;
  auVar254._16_4_ =
       auVar326._16_4_ * (auVar94._0_4_ * auVar326._16_4_ + fVar315 * fVar200) + fVar315 * fVar118;
  auVar254._20_4_ =
       auVar326._20_4_ * (auVar94._4_4_ * auVar326._20_4_ + fVar316 * fVar204) + fVar316 * fVar206;
  auVar254._24_4_ =
       auVar326._24_4_ * (auVar94._8_4_ * auVar326._24_4_ + fVar317 * fVar235) + fVar317 * fVar258;
  auVar254._28_4_ = fVar345 + fVar355 + auVar253._28_4_;
  auVar298._0_4_ =
       fVar304 * fVar283 + auVar326._0_4_ * (auVar326._0_4_ * auVar180._0_4_ + fVar304 * fVar202);
  auVar298._4_4_ =
       fVar312 * fVar300 + auVar326._4_4_ * (auVar326._4_4_ * auVar180._4_4_ + fVar312 * fVar207);
  auVar298._8_4_ =
       fVar313 * fVar301 + auVar326._8_4_ * (auVar326._8_4_ * auVar180._8_4_ + fVar313 * fVar237);
  auVar298._12_4_ =
       fVar314 * fVar302 + auVar326._12_4_ * (auVar326._12_4_ * fVar256 + fVar314 * fVar255);
  auVar298._16_4_ =
       fVar315 * fVar343 + auVar326._16_4_ * (auVar326._16_4_ * auVar180._0_4_ + fVar315 * fVar202);
  auVar298._20_4_ =
       fVar316 * fVar303 + auVar326._20_4_ * (auVar326._20_4_ * auVar180._4_4_ + fVar316 * fVar207);
  auVar298._24_4_ =
       fVar317 * fVar344 + auVar326._24_4_ * (auVar326._24_4_ * auVar180._8_4_ + fVar317 * fVar237);
  auVar298._28_4_ = fVar355 + fVar342 + fVar256 + fVar255;
  auVar281._0_4_ = fVar304 * auVar109._0_4_ + auVar326._0_4_ * auVar254._0_4_;
  auVar281._4_4_ = fVar312 * auVar109._4_4_ + auVar326._4_4_ * auVar254._4_4_;
  auVar281._8_4_ = fVar313 * auVar109._8_4_ + auVar326._8_4_ * auVar254._8_4_;
  auVar281._12_4_ = fVar314 * auVar109._12_4_ + auVar326._12_4_ * auVar254._12_4_;
  auVar281._16_4_ = fVar315 * auVar109._16_4_ + auVar326._16_4_ * auVar254._16_4_;
  auVar281._20_4_ = fVar316 * auVar109._20_4_ + auVar326._20_4_ * auVar254._20_4_;
  auVar281._24_4_ = fVar317 * auVar109._24_4_ + auVar326._24_4_ * auVar254._24_4_;
  auVar281._28_4_ = fVar345 + fVar256 + fVar255;
  auVar311._0_4_ = fVar304 * auVar147._0_4_ + auVar326._0_4_ * auVar298._0_4_;
  auVar311._4_4_ = fVar312 * auVar147._4_4_ + auVar326._4_4_ * auVar298._4_4_;
  auVar311._8_4_ = fVar313 * auVar147._8_4_ + auVar326._8_4_ * auVar298._8_4_;
  auVar311._12_4_ = fVar314 * auVar147._12_4_ + auVar326._12_4_ * auVar298._12_4_;
  auVar311._16_4_ = fVar315 * auVar147._16_4_ + auVar326._16_4_ * auVar298._16_4_;
  auVar311._20_4_ = fVar316 * auVar147._20_4_ + auVar326._20_4_ * auVar298._20_4_;
  auVar311._24_4_ = fVar317 * auVar147._24_4_ + auVar326._24_4_ * auVar298._24_4_;
  auVar311._28_4_ = auVar17._28_4_ + auVar326._28_4_;
  auVar21 = vsubps_avx(auVar254,auVar109);
  auVar19 = vsubps_avx(auVar298,auVar147);
  local_2a0 = local_620 * auVar21._0_4_ * 3.0;
  fStack_29c = fStack_61c * auVar21._4_4_ * 3.0;
  auVar17._4_4_ = fStack_29c;
  auVar17._0_4_ = local_2a0;
  fStack_298 = fStack_618 * auVar21._8_4_ * 3.0;
  auVar17._8_4_ = fStack_298;
  fStack_294 = fStack_614 * auVar21._12_4_ * 3.0;
  auVar17._12_4_ = fStack_294;
  fStack_290 = local_620 * auVar21._16_4_ * 3.0;
  auVar17._16_4_ = fStack_290;
  fStack_28c = fStack_61c * auVar21._20_4_ * 3.0;
  auVar17._20_4_ = fStack_28c;
  fStack_288 = fStack_618 * auVar21._24_4_ * 3.0;
  auVar17._24_4_ = fStack_288;
  auVar17._28_4_ = auVar21._28_4_;
  local_2c0 = local_620 * auVar19._0_4_ * 3.0;
  fStack_2bc = fStack_61c * auVar19._4_4_ * 3.0;
  auVar22._4_4_ = fStack_2bc;
  auVar22._0_4_ = local_2c0;
  fStack_2b8 = fStack_618 * auVar19._8_4_ * 3.0;
  auVar22._8_4_ = fStack_2b8;
  fStack_2b4 = fStack_614 * auVar19._12_4_ * 3.0;
  auVar22._12_4_ = fStack_2b4;
  fStack_2b0 = local_620 * auVar19._16_4_ * 3.0;
  auVar22._16_4_ = fStack_2b0;
  fStack_2ac = fStack_61c * auVar19._20_4_ * 3.0;
  auVar22._20_4_ = fStack_2ac;
  fStack_2a8 = fStack_618 * auVar19._24_4_ * 3.0;
  auVar22._24_4_ = fStack_2a8;
  auVar22._28_4_ = auVar254._28_4_;
  auVar19 = vperm2f128_avx(auVar281,auVar281,1);
  auVar19 = vshufps_avx(auVar19,auVar281,0x30);
  auVar108 = vshufps_avx(auVar281,auVar19,0x29);
  auVar17 = vsubps_avx(auVar281,auVar17);
  auVar19 = vperm2f128_avx(auVar17,auVar17,1);
  auVar19 = vshufps_avx(auVar19,auVar17,0x30);
  auVar19 = vshufps_avx(auVar17,auVar19,0x29);
  auVar22 = vsubps_avx(auVar311,auVar22);
  auVar17 = vperm2f128_avx(auVar22,auVar22,1);
  auVar17 = vshufps_avx(auVar17,auVar22,0x30);
  local_200 = vshufps_avx(auVar22,auVar17,0x29);
  auVar23 = vsubps_avx(auVar281,local_220);
  auVar109 = vsubps_avx(auVar108,auVar107);
  fVar200 = auVar109._0_4_ + auVar23._0_4_;
  fVar202 = auVar109._4_4_ + auVar23._4_4_;
  fVar204 = auVar109._8_4_ + auVar23._8_4_;
  fVar207 = auVar109._12_4_ + auVar23._12_4_;
  fVar235 = auVar109._16_4_ + auVar23._16_4_;
  fVar237 = auVar109._20_4_ + auVar23._20_4_;
  fVar239 = auVar109._24_4_ + auVar23._24_4_;
  auVar17 = vperm2f128_avx(auVar199,auVar199,1);
  auVar17 = vshufps_avx(auVar17,auVar199,0x30);
  local_240 = vshufps_avx(auVar199,auVar17,0x29);
  auVar17 = vperm2f128_avx(auVar311,auVar311,1);
  auVar17 = vshufps_avx(auVar17,auVar311,0x30);
  auVar22 = vshufps_avx(auVar311,auVar17,0x29);
  auVar17 = vsubps_avx(auVar311,auVar199);
  auVar147 = vsubps_avx(auVar22,local_240);
  fVar241 = auVar147._0_4_ + auVar17._0_4_;
  fVar255 = auVar147._4_4_ + auVar17._4_4_;
  fVar256 = auVar147._8_4_ + auVar17._8_4_;
  fVar257 = auVar147._12_4_ + auVar17._12_4_;
  fVar115 = auVar147._16_4_ + auVar17._16_4_;
  fVar116 = auVar147._20_4_ + auVar17._20_4_;
  fVar117 = auVar147._24_4_ + auVar17._24_4_;
  auVar24._4_4_ = fVar202 * auVar199._4_4_;
  auVar24._0_4_ = fVar200 * auVar199._0_4_;
  auVar24._8_4_ = fVar204 * auVar199._8_4_;
  auVar24._12_4_ = fVar207 * auVar199._12_4_;
  auVar24._16_4_ = fVar235 * auVar199._16_4_;
  auVar24._20_4_ = fVar237 * auVar199._20_4_;
  auVar24._24_4_ = fVar239 * auVar199._24_4_;
  auVar24._28_4_ = auVar17._28_4_;
  auVar25._4_4_ = fVar255 * local_220._4_4_;
  auVar25._0_4_ = fVar241 * local_220._0_4_;
  auVar25._8_4_ = fVar256 * local_220._8_4_;
  auVar25._12_4_ = fVar257 * local_220._12_4_;
  auVar25._16_4_ = fVar115 * local_220._16_4_;
  auVar25._20_4_ = fVar116 * local_220._20_4_;
  auVar25._24_4_ = fVar117 * local_220._24_4_;
  auVar25._28_4_ = fVar345;
  auVar24 = vsubps_avx(auVar24,auVar25);
  local_260 = local_220._0_4_ + local_260;
  fStack_25c = local_220._4_4_ + fStack_25c;
  fStack_258 = local_220._8_4_ + fStack_258;
  fStack_254 = local_220._12_4_ + fStack_254;
  fStack_250 = local_220._16_4_ + fStack_250;
  fStack_24c = local_220._20_4_ + fStack_24c;
  fStack_248 = local_220._24_4_ + fStack_248;
  fStack_244 = local_220._28_4_ + auVar18._28_4_;
  local_280 = local_280 + auVar199._0_4_;
  fStack_27c = fStack_27c + auVar199._4_4_;
  fStack_278 = fStack_278 + auVar199._8_4_;
  fStack_274 = fStack_274 + auVar199._12_4_;
  fStack_270 = fStack_270 + auVar199._16_4_;
  fStack_26c = fStack_26c + auVar199._20_4_;
  fStack_268 = fStack_268 + auVar199._24_4_;
  fStack_264 = fVar348 + auVar199._28_4_;
  auVar18._4_4_ = fVar202 * fStack_27c;
  auVar18._0_4_ = fVar200 * local_280;
  auVar18._8_4_ = fVar204 * fStack_278;
  auVar18._12_4_ = fVar207 * fStack_274;
  auVar18._16_4_ = fVar235 * fStack_270;
  auVar18._20_4_ = fVar237 * fStack_26c;
  auVar18._24_4_ = fVar239 * fStack_268;
  auVar18._28_4_ = fVar348;
  auVar26._4_4_ = fVar255 * fStack_25c;
  auVar26._0_4_ = fVar241 * local_260;
  auVar26._8_4_ = fVar256 * fStack_258;
  auVar26._12_4_ = fVar257 * fStack_254;
  auVar26._16_4_ = fVar115 * fStack_250;
  auVar26._20_4_ = fVar116 * fStack_24c;
  auVar26._24_4_ = fVar117 * fStack_248;
  auVar26._28_4_ = fVar348 + auVar199._28_4_;
  auVar18 = vsubps_avx(auVar18,auVar26);
  local_660 = auVar20._0_4_;
  fStack_65c = auVar20._4_4_;
  fStack_658 = auVar20._8_4_;
  fStack_654 = auVar20._12_4_;
  fStack_650 = auVar20._16_4_;
  fStack_64c = auVar20._20_4_;
  fStack_648 = auVar20._24_4_;
  auVar27._4_4_ = fVar202 * fStack_65c;
  auVar27._0_4_ = fVar200 * local_660;
  auVar27._8_4_ = fVar204 * fStack_658;
  auVar27._12_4_ = fVar207 * fStack_654;
  auVar27._16_4_ = fVar235 * fStack_650;
  auVar27._20_4_ = fVar237 * fStack_64c;
  auVar27._24_4_ = fVar239 * fStack_648;
  auVar27._28_4_ = fVar348;
  local_700._0_4_ = auVar106._0_4_;
  local_700._4_4_ = auVar106._4_4_;
  fStack_6f8 = auVar106._8_4_;
  fStack_6f4 = auVar106._12_4_;
  fStack_6f0 = auVar106._16_4_;
  fStack_6ec = auVar106._20_4_;
  fStack_6e8 = auVar106._24_4_;
  auVar28._4_4_ = fVar255 * (float)local_700._4_4_;
  auVar28._0_4_ = fVar241 * (float)local_700._0_4_;
  auVar28._8_4_ = fVar256 * fStack_6f8;
  auVar28._12_4_ = fVar257 * fStack_6f4;
  auVar28._16_4_ = fVar115 * fStack_6f0;
  auVar28._20_4_ = fVar116 * fStack_6ec;
  auVar28._24_4_ = fVar117 * fStack_6e8;
  auVar28._28_4_ = local_220._28_4_;
  auVar25 = vsubps_avx(auVar27,auVar28);
  auVar29._4_4_ = local_240._4_4_ * fVar202;
  auVar29._0_4_ = local_240._0_4_ * fVar200;
  auVar29._8_4_ = local_240._8_4_ * fVar204;
  auVar29._12_4_ = local_240._12_4_ * fVar207;
  auVar29._16_4_ = local_240._16_4_ * fVar235;
  auVar29._20_4_ = local_240._20_4_ * fVar237;
  auVar29._24_4_ = local_240._24_4_ * fVar239;
  auVar29._28_4_ = fVar348;
  auVar30._4_4_ = auVar107._4_4_ * fVar255;
  auVar30._0_4_ = auVar107._0_4_ * fVar241;
  auVar30._8_4_ = auVar107._8_4_ * fVar256;
  auVar30._12_4_ = auVar107._12_4_ * fVar257;
  auVar30._16_4_ = auVar107._16_4_ * fVar115;
  auVar30._20_4_ = auVar107._20_4_ * fVar116;
  auVar30._24_4_ = auVar107._24_4_ * fVar117;
  auVar30._28_4_ = local_240._28_4_;
  local_620 = auVar19._0_4_;
  fStack_61c = auVar19._4_4_;
  fStack_618 = auVar19._8_4_;
  fStack_614 = auVar19._12_4_;
  fStack_610 = auVar19._16_4_;
  fStack_60c = auVar19._20_4_;
  fStack_608 = auVar19._24_4_;
  auVar26 = vsubps_avx(auVar29,auVar30);
  auVar31._4_4_ = auVar311._4_4_ * fVar202;
  auVar31._0_4_ = auVar311._0_4_ * fVar200;
  auVar31._8_4_ = auVar311._8_4_ * fVar204;
  auVar31._12_4_ = auVar311._12_4_ * fVar207;
  auVar31._16_4_ = auVar311._16_4_ * fVar235;
  auVar31._20_4_ = auVar311._20_4_ * fVar237;
  auVar31._24_4_ = auVar311._24_4_ * fVar239;
  auVar31._28_4_ = fVar348;
  auVar32._4_4_ = fVar255 * auVar281._4_4_;
  auVar32._0_4_ = fVar241 * auVar281._0_4_;
  auVar32._8_4_ = fVar256 * auVar281._8_4_;
  auVar32._12_4_ = fVar257 * auVar281._12_4_;
  auVar32._16_4_ = fVar115 * auVar281._16_4_;
  auVar32._20_4_ = fVar116 * auVar281._20_4_;
  auVar32._24_4_ = fVar117 * auVar281._24_4_;
  auVar32._28_4_ = fStack_244;
  auVar27 = vsubps_avx(auVar31,auVar32);
  local_2a0 = auVar281._0_4_ + local_2a0;
  fStack_29c = auVar281._4_4_ + fStack_29c;
  fStack_298 = auVar281._8_4_ + fStack_298;
  fStack_294 = auVar281._12_4_ + fStack_294;
  fStack_290 = auVar281._16_4_ + fStack_290;
  fStack_28c = auVar281._20_4_ + fStack_28c;
  fStack_288 = auVar281._24_4_ + fStack_288;
  fStack_284 = auVar281._28_4_ + auVar21._28_4_;
  local_2c0 = auVar311._0_4_ + local_2c0;
  fStack_2bc = auVar311._4_4_ + fStack_2bc;
  fStack_2b8 = auVar311._8_4_ + fStack_2b8;
  fStack_2b4 = auVar311._12_4_ + fStack_2b4;
  fStack_2b0 = auVar311._16_4_ + fStack_2b0;
  fStack_2ac = auVar311._20_4_ + fStack_2ac;
  fStack_2a8 = auVar311._24_4_ + fStack_2a8;
  fStack_2a4 = auVar311._28_4_ + auVar254._28_4_;
  auVar21._4_4_ = fVar202 * fStack_2bc;
  auVar21._0_4_ = fVar200 * local_2c0;
  auVar21._8_4_ = fVar204 * fStack_2b8;
  auVar21._12_4_ = fVar207 * fStack_2b4;
  auVar21._16_4_ = fVar235 * fStack_2b0;
  auVar21._20_4_ = fVar237 * fStack_2ac;
  auVar21._24_4_ = fVar239 * fStack_2a8;
  auVar21._28_4_ = auVar311._28_4_ + auVar254._28_4_;
  auVar33._4_4_ = fStack_29c * fVar255;
  auVar33._0_4_ = local_2a0 * fVar241;
  auVar33._8_4_ = fStack_298 * fVar256;
  auVar33._12_4_ = fStack_294 * fVar257;
  auVar33._16_4_ = fStack_290 * fVar115;
  auVar33._20_4_ = fStack_28c * fVar116;
  auVar33._24_4_ = fStack_288 * fVar117;
  auVar33._28_4_ = fStack_284;
  auVar21 = vsubps_avx(auVar21,auVar33);
  auVar34._4_4_ = fVar202 * local_200._4_4_;
  auVar34._0_4_ = fVar200 * local_200._0_4_;
  auVar34._8_4_ = fVar204 * local_200._8_4_;
  auVar34._12_4_ = fVar207 * local_200._12_4_;
  auVar34._16_4_ = fVar235 * local_200._16_4_;
  auVar34._20_4_ = fVar237 * local_200._20_4_;
  auVar34._24_4_ = fVar239 * local_200._24_4_;
  auVar34._28_4_ = fStack_284;
  auVar35._4_4_ = fVar255 * fStack_61c;
  auVar35._0_4_ = fVar241 * local_620;
  auVar35._8_4_ = fVar256 * fStack_618;
  auVar35._12_4_ = fVar257 * fStack_614;
  auVar35._16_4_ = fVar115 * fStack_610;
  auVar35._20_4_ = fVar116 * fStack_60c;
  auVar35._24_4_ = fVar117 * fStack_608;
  auVar35._28_4_ = local_200._28_4_;
  auVar28 = vsubps_avx(auVar34,auVar35);
  auVar36._4_4_ = fVar202 * auVar22._4_4_;
  auVar36._0_4_ = fVar200 * auVar22._0_4_;
  auVar36._8_4_ = fVar204 * auVar22._8_4_;
  auVar36._12_4_ = fVar207 * auVar22._12_4_;
  auVar36._16_4_ = fVar235 * auVar22._16_4_;
  auVar36._20_4_ = fVar237 * auVar22._20_4_;
  auVar36._24_4_ = fVar239 * auVar22._24_4_;
  auVar36._28_4_ = auVar109._28_4_ + auVar23._28_4_;
  auVar23._4_4_ = auVar108._4_4_ * fVar255;
  auVar23._0_4_ = auVar108._0_4_ * fVar241;
  auVar23._8_4_ = auVar108._8_4_ * fVar256;
  auVar23._12_4_ = auVar108._12_4_ * fVar257;
  auVar23._16_4_ = auVar108._16_4_ * fVar115;
  auVar23._20_4_ = auVar108._20_4_ * fVar116;
  auVar23._24_4_ = auVar108._24_4_ * fVar117;
  auVar23._28_4_ = auVar147._28_4_ + auVar17._28_4_;
  auVar23 = vsubps_avx(auVar36,auVar23);
  auVar19 = vminps_avx(auVar24,auVar18);
  auVar106 = vmaxps_avx(auVar24,auVar18);
  auVar20 = vminps_avx(auVar25,auVar26);
  auVar20 = vminps_avx(auVar19,auVar20);
  auVar19 = vmaxps_avx(auVar25,auVar26);
  auVar106 = vmaxps_avx(auVar106,auVar19);
  auVar17 = vminps_avx(auVar27,auVar21);
  auVar19 = vmaxps_avx(auVar27,auVar21);
  auVar18 = vminps_avx(auVar28,auVar23);
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar18 = vminps_avx(auVar20,auVar18);
  auVar20 = vmaxps_avx(auVar28,auVar23);
  auVar19 = vmaxps_avx(auVar19,auVar20);
  auVar19 = vmaxps_avx(auVar106,auVar19);
  auVar106 = vcmpps_avx(auVar18,local_1c0,2);
  auVar19 = vcmpps_avx(auVar19,local_1e0,5);
  auVar106 = vandps_avx(auVar19,auVar106);
  auVar19 = local_2e0 & auVar106;
  if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0x7f,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar19 >> 0xbf,0) != '\0') ||
      (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0') {
    auVar19 = vsubps_avx(auVar107,local_220);
    auVar20 = vsubps_avx(auVar108,auVar281);
    fVar202 = auVar19._0_4_ + auVar20._0_4_;
    fVar204 = auVar19._4_4_ + auVar20._4_4_;
    fVar207 = auVar19._8_4_ + auVar20._8_4_;
    fVar235 = auVar19._12_4_ + auVar20._12_4_;
    fVar237 = auVar19._16_4_ + auVar20._16_4_;
    fVar239 = auVar19._20_4_ + auVar20._20_4_;
    fVar241 = auVar19._24_4_ + auVar20._24_4_;
    auVar18 = vsubps_avx(local_240,auVar199);
    auVar21 = vsubps_avx(auVar22,auVar311);
    fVar255 = auVar18._0_4_ + auVar21._0_4_;
    fVar256 = auVar18._4_4_ + auVar21._4_4_;
    fVar257 = auVar18._8_4_ + auVar21._8_4_;
    fVar115 = auVar18._12_4_ + auVar21._12_4_;
    fVar116 = auVar18._16_4_ + auVar21._16_4_;
    fVar117 = auVar18._20_4_ + auVar21._20_4_;
    fVar118 = auVar18._24_4_ + auVar21._24_4_;
    fVar200 = auVar21._28_4_;
    auVar37._4_4_ = auVar199._4_4_ * fVar204;
    auVar37._0_4_ = auVar199._0_4_ * fVar202;
    auVar37._8_4_ = auVar199._8_4_ * fVar207;
    auVar37._12_4_ = auVar199._12_4_ * fVar235;
    auVar37._16_4_ = auVar199._16_4_ * fVar237;
    auVar37._20_4_ = auVar199._20_4_ * fVar239;
    auVar37._24_4_ = auVar199._24_4_ * fVar241;
    auVar37._28_4_ = auVar199._28_4_;
    auVar38._4_4_ = local_220._4_4_ * fVar256;
    auVar38._0_4_ = local_220._0_4_ * fVar255;
    auVar38._8_4_ = local_220._8_4_ * fVar257;
    auVar38._12_4_ = local_220._12_4_ * fVar115;
    auVar38._16_4_ = local_220._16_4_ * fVar116;
    auVar38._20_4_ = local_220._20_4_ * fVar117;
    auVar38._24_4_ = local_220._24_4_ * fVar118;
    auVar38._28_4_ = local_220._28_4_;
    auVar21 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = fVar204 * fStack_27c;
    auVar39._0_4_ = fVar202 * local_280;
    auVar39._8_4_ = fVar207 * fStack_278;
    auVar39._12_4_ = fVar235 * fStack_274;
    auVar39._16_4_ = fVar237 * fStack_270;
    auVar39._20_4_ = fVar239 * fStack_26c;
    auVar39._24_4_ = fVar241 * fStack_268;
    auVar39._28_4_ = auVar199._28_4_;
    auVar40._4_4_ = fVar256 * fStack_25c;
    auVar40._0_4_ = fVar255 * local_260;
    auVar40._8_4_ = fVar257 * fStack_258;
    auVar40._12_4_ = fVar115 * fStack_254;
    auVar40._16_4_ = fVar116 * fStack_250;
    auVar40._20_4_ = fVar117 * fStack_24c;
    auVar40._24_4_ = fVar118 * fStack_248;
    auVar40._28_4_ = fVar200;
    auVar23 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = fVar204 * fStack_65c;
    auVar41._0_4_ = fVar202 * local_660;
    auVar41._8_4_ = fVar207 * fStack_658;
    auVar41._12_4_ = fVar235 * fStack_654;
    auVar41._16_4_ = fVar237 * fStack_650;
    auVar41._20_4_ = fVar239 * fStack_64c;
    auVar41._24_4_ = fVar241 * fStack_648;
    auVar41._28_4_ = fVar200;
    auVar42._4_4_ = fVar256 * (float)local_700._4_4_;
    auVar42._0_4_ = fVar255 * (float)local_700._0_4_;
    auVar42._8_4_ = fVar257 * fStack_6f8;
    auVar42._12_4_ = fVar115 * fStack_6f4;
    auVar42._16_4_ = fVar116 * fStack_6f0;
    auVar42._20_4_ = fVar117 * fStack_6ec;
    auVar42._24_4_ = fVar118 * fStack_6e8;
    auVar42._28_4_ = auVar17._28_4_;
    auVar109 = vsubps_avx(auVar41,auVar42);
    auVar43._4_4_ = local_240._4_4_ * fVar204;
    auVar43._0_4_ = local_240._0_4_ * fVar202;
    auVar43._8_4_ = local_240._8_4_ * fVar207;
    auVar43._12_4_ = local_240._12_4_ * fVar235;
    auVar43._16_4_ = local_240._16_4_ * fVar237;
    auVar43._20_4_ = local_240._20_4_ * fVar239;
    auVar43._24_4_ = local_240._24_4_ * fVar241;
    auVar43._28_4_ = auVar17._28_4_;
    auVar44._4_4_ = auVar107._4_4_ * fVar256;
    auVar44._0_4_ = auVar107._0_4_ * fVar255;
    auVar44._8_4_ = auVar107._8_4_ * fVar257;
    auVar44._12_4_ = auVar107._12_4_ * fVar115;
    auVar44._16_4_ = auVar107._16_4_ * fVar116;
    auVar44._20_4_ = auVar107._20_4_ * fVar117;
    uVar73 = auVar107._28_4_;
    auVar44._24_4_ = auVar107._24_4_ * fVar118;
    auVar44._28_4_ = uVar73;
    auVar107 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = auVar311._4_4_ * fVar204;
    auVar45._0_4_ = auVar311._0_4_ * fVar202;
    auVar45._8_4_ = auVar311._8_4_ * fVar207;
    auVar45._12_4_ = auVar311._12_4_ * fVar235;
    auVar45._16_4_ = auVar311._16_4_ * fVar237;
    auVar45._20_4_ = auVar311._20_4_ * fVar239;
    auVar45._24_4_ = auVar311._24_4_ * fVar241;
    auVar45._28_4_ = uVar73;
    auVar46._4_4_ = auVar281._4_4_ * fVar256;
    auVar46._0_4_ = auVar281._0_4_ * fVar255;
    auVar46._8_4_ = auVar281._8_4_ * fVar257;
    auVar46._12_4_ = auVar281._12_4_ * fVar115;
    auVar46._16_4_ = auVar281._16_4_ * fVar116;
    auVar46._20_4_ = auVar281._20_4_ * fVar117;
    auVar46._24_4_ = auVar281._24_4_ * fVar118;
    auVar46._28_4_ = auVar281._28_4_;
    auVar147 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = fVar204 * fStack_2bc;
    auVar47._0_4_ = fVar202 * local_2c0;
    auVar47._8_4_ = fVar207 * fStack_2b8;
    auVar47._12_4_ = fVar235 * fStack_2b4;
    auVar47._16_4_ = fVar237 * fStack_2b0;
    auVar47._20_4_ = fVar239 * fStack_2ac;
    auVar47._24_4_ = fVar241 * fStack_2a8;
    auVar47._28_4_ = uVar73;
    auVar48._4_4_ = fVar256 * fStack_29c;
    auVar48._0_4_ = fVar255 * local_2a0;
    auVar48._8_4_ = fVar257 * fStack_298;
    auVar48._12_4_ = fVar115 * fStack_294;
    auVar48._16_4_ = fVar116 * fStack_290;
    auVar48._20_4_ = fVar117 * fStack_28c;
    auVar48._24_4_ = fVar118 * fStack_288;
    auVar48._28_4_ = auVar311._28_4_;
    auVar24 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = fVar204 * local_200._4_4_;
    auVar49._0_4_ = fVar202 * local_200._0_4_;
    auVar49._8_4_ = fVar207 * local_200._8_4_;
    auVar49._12_4_ = fVar235 * local_200._12_4_;
    auVar49._16_4_ = fVar237 * local_200._16_4_;
    auVar49._20_4_ = fVar239 * local_200._20_4_;
    auVar49._24_4_ = fVar241 * local_200._24_4_;
    auVar49._28_4_ = auVar311._28_4_;
    auVar50._4_4_ = fStack_61c * fVar256;
    auVar50._0_4_ = local_620 * fVar255;
    auVar50._8_4_ = fStack_618 * fVar257;
    auVar50._12_4_ = fStack_614 * fVar115;
    auVar50._16_4_ = fStack_610 * fVar116;
    auVar50._20_4_ = fStack_60c * fVar117;
    auVar50._24_4_ = fStack_608 * fVar118;
    auVar50._28_4_ = local_240._28_4_;
    auVar25 = vsubps_avx(auVar49,auVar50);
    auVar51._4_4_ = fVar204 * auVar22._4_4_;
    auVar51._0_4_ = fVar202 * auVar22._0_4_;
    auVar51._8_4_ = fVar207 * auVar22._8_4_;
    auVar51._12_4_ = fVar235 * auVar22._12_4_;
    auVar51._16_4_ = fVar237 * auVar22._16_4_;
    auVar51._20_4_ = fVar239 * auVar22._20_4_;
    auVar51._24_4_ = fVar241 * auVar22._24_4_;
    auVar51._28_4_ = auVar19._28_4_ + auVar20._28_4_;
    auVar52._4_4_ = auVar108._4_4_ * fVar256;
    auVar52._0_4_ = auVar108._0_4_ * fVar255;
    auVar52._8_4_ = auVar108._8_4_ * fVar257;
    auVar52._12_4_ = auVar108._12_4_ * fVar115;
    auVar52._16_4_ = auVar108._16_4_ * fVar116;
    auVar52._20_4_ = auVar108._20_4_ * fVar117;
    auVar52._24_4_ = auVar108._24_4_ * fVar118;
    auVar52._28_4_ = auVar18._28_4_ + fVar200;
    auVar108 = vsubps_avx(auVar51,auVar52);
    auVar20 = vminps_avx(auVar21,auVar23);
    auVar19 = vmaxps_avx(auVar21,auVar23);
    auVar17 = vminps_avx(auVar109,auVar107);
    auVar17 = vminps_avx(auVar20,auVar17);
    auVar20 = vmaxps_avx(auVar109,auVar107);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar18 = vminps_avx(auVar147,auVar24);
    auVar20 = vmaxps_avx(auVar147,auVar24);
    auVar107 = vminps_avx(auVar25,auVar108);
    auVar18 = vminps_avx(auVar18,auVar107);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar25,auVar108);
    auVar20 = vmaxps_avx(auVar20,auVar17);
    auVar20 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vcmpps_avx(auVar18,local_1c0,2);
    auVar20 = vcmpps_avx(auVar20,local_1e0,5);
    auVar19 = vandps_avx(auVar20,auVar19);
    auVar106 = vandps_avx(local_2e0,auVar106);
    auVar20 = auVar106 & auVar19;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0x7f,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0xbf,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0')
    {
      auVar106 = vandps_avx(auVar19,auVar106);
      uVar64 = vmovmskps_avx(auVar106);
      if (uVar64 != 0) {
        auStack_4b0[uVar69] = uVar64 & 0xff;
        uVar6 = vmovlps_avx(local_420);
        *(undefined8 *)(afStack_340 + uVar69 * 2) = uVar6;
        uVar7 = vmovlps_avx(auVar120);
        auStack_1a0[uVar69] = uVar7;
        uVar69 = (ulong)((int)uVar69 + 1);
      }
    }
  }
LAB_008f06d6:
  do {
    do {
      do {
        do {
          if ((int)uVar69 == 0) {
            auVar54 = ZEXT812(0) << 0x20;
            if (bVar75) goto LAB_008f176b;
            uVar73 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar105._4_4_ = uVar73;
            auVar105._0_4_ = uVar73;
            auVar105._8_4_ = uVar73;
            auVar105._12_4_ = uVar73;
            auVar94 = vcmpps_avx(local_430,auVar105,2);
            uVar65 = vmovmskps_avx(auVar94);
            uVar66 = (ulong)((uint)uVar66 & (uint)uVar66 + 0xf & uVar65);
            goto LAB_008ef384;
          }
          uVar67 = (int)uVar69 - 1;
          uVar70 = (ulong)uVar67;
          uVar64 = auStack_4b0[uVar70];
          fVar200 = afStack_340[uVar70 * 2];
          fVar202 = afStack_340[uVar70 * 2 + 1];
          auVar329._8_8_ = 0;
          auVar329._0_8_ = auStack_1a0[uVar70];
          auVar334 = ZEXT1664(auVar329);
          uVar7 = 0;
          if (uVar64 != 0) {
            for (; (uVar64 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar64 = uVar64 - 1 & uVar64;
          auStack_4b0[uVar70] = uVar64;
          if (uVar64 == 0) {
            uVar69 = (ulong)uVar67;
          }
          fVar207 = (float)(uVar7 + 1) * 0.14285715;
          fVar204 = (1.0 - (float)uVar7 * 0.14285715) * fVar200 +
                    fVar202 * (float)uVar7 * 0.14285715;
          fVar200 = (1.0 - fVar207) * fVar200 + fVar202 * fVar207;
          fVar202 = fVar200 - fVar204;
          if (0.16666667 <= fVar202) {
            auVar94 = vinsertps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar200),0x10);
            auVar367 = ZEXT1664(auVar94);
            goto LAB_008f0067;
          }
          auVar94 = vshufps_avx(auVar329,auVar329,0x50);
          auVar128._8_4_ = 0x3f800000;
          auVar128._0_8_ = 0x3f8000003f800000;
          auVar128._12_4_ = 0x3f800000;
          auVar290 = vsubps_avx(auVar128,auVar94);
          fVar207 = auVar94._0_4_;
          fVar235 = auVar94._4_4_;
          fVar237 = auVar94._8_4_;
          fVar239 = auVar94._12_4_;
          fVar241 = auVar290._0_4_;
          fVar255 = auVar290._4_4_;
          fVar256 = auVar290._8_4_;
          fVar257 = auVar290._12_4_;
          auVar164._0_4_ = fVar207 * auVar292._0_4_ + fVar241 * auVar360._0_4_;
          auVar164._4_4_ = fVar235 * auVar292._4_4_ + fVar255 * auVar360._4_4_;
          auVar164._8_4_ = fVar237 * auVar292._0_4_ + fVar256 * auVar360._0_4_;
          auVar164._12_4_ = fVar239 * auVar292._4_4_ + fVar257 * auVar360._4_4_;
          auVar224._0_4_ = auVar307._0_4_ * fVar207 + auVar353._0_4_ * fVar241;
          auVar224._4_4_ = auVar307._4_4_ * fVar235 + auVar353._4_4_ * fVar255;
          auVar224._8_4_ = auVar307._0_4_ * fVar237 + auVar353._0_4_ * fVar256;
          auVar224._12_4_ = auVar307._4_4_ * fVar239 + auVar353._4_4_ * fVar257;
          auVar247._0_4_ = auVar321._0_4_ * fVar207 + auVar340._0_4_ * fVar241;
          auVar247._4_4_ = auVar321._4_4_ * fVar235 + auVar340._4_4_ * fVar255;
          auVar247._8_4_ = auVar321._0_4_ * fVar237 + auVar340._0_4_ * fVar256;
          auVar247._12_4_ = auVar321._4_4_ * fVar239 + auVar340._4_4_ * fVar257;
          auVar91._0_4_ = auVar89._0_4_ * fVar207 + auVar127._0_4_ * fVar241;
          auVar91._4_4_ = auVar89._4_4_ * fVar235 + auVar127._4_4_ * fVar255;
          auVar91._8_4_ = auVar89._0_4_ * fVar237 + auVar127._0_4_ * fVar256;
          auVar91._12_4_ = auVar89._4_4_ * fVar239 + auVar127._4_4_ * fVar257;
          auVar148._16_16_ = auVar164;
          auVar148._0_16_ = auVar164;
          auVar182._16_16_ = auVar224;
          auVar182._0_16_ = auVar224;
          auVar234._16_16_ = auVar247;
          auVar234._0_16_ = auVar247;
          auVar106 = ZEXT2032(CONCAT416(fVar200,ZEXT416((uint)fVar204)));
          auVar106 = vshufps_avx(auVar106,auVar106,0);
          auVar19 = vsubps_avx(auVar182,auVar148);
          fVar207 = auVar106._0_4_;
          fVar235 = auVar106._4_4_;
          fVar237 = auVar106._8_4_;
          fVar239 = auVar106._12_4_;
          fVar241 = auVar106._16_4_;
          fVar255 = auVar106._20_4_;
          fVar256 = auVar106._24_4_;
          auVar149._0_4_ = auVar164._0_4_ + auVar19._0_4_ * fVar207;
          auVar149._4_4_ = auVar164._4_4_ + auVar19._4_4_ * fVar235;
          auVar149._8_4_ = auVar164._8_4_ + auVar19._8_4_ * fVar237;
          auVar149._12_4_ = auVar164._12_4_ + auVar19._12_4_ * fVar239;
          auVar149._16_4_ = auVar164._0_4_ + auVar19._16_4_ * fVar241;
          auVar149._20_4_ = auVar164._4_4_ + auVar19._20_4_ * fVar255;
          auVar149._24_4_ = auVar164._8_4_ + auVar19._24_4_ * fVar256;
          auVar149._28_4_ = auVar164._12_4_ + auVar19._28_4_;
          auVar106 = vsubps_avx(auVar234,auVar182);
          auVar183._0_4_ = auVar224._0_4_ + auVar106._0_4_ * fVar207;
          auVar183._4_4_ = auVar224._4_4_ + auVar106._4_4_ * fVar235;
          auVar183._8_4_ = auVar224._8_4_ + auVar106._8_4_ * fVar237;
          auVar183._12_4_ = auVar224._12_4_ + auVar106._12_4_ * fVar239;
          auVar183._16_4_ = auVar224._0_4_ + auVar106._16_4_ * fVar241;
          auVar183._20_4_ = auVar224._4_4_ + auVar106._20_4_ * fVar255;
          auVar183._24_4_ = auVar224._8_4_ + auVar106._24_4_ * fVar256;
          auVar183._28_4_ = auVar224._12_4_ + auVar106._28_4_;
          auVar94 = vsubps_avx(auVar91,auVar247);
          auVar110._0_4_ = auVar247._0_4_ + auVar94._0_4_ * fVar207;
          auVar110._4_4_ = auVar247._4_4_ + auVar94._4_4_ * fVar235;
          auVar110._8_4_ = auVar247._8_4_ + auVar94._8_4_ * fVar237;
          auVar110._12_4_ = auVar247._12_4_ + auVar94._12_4_ * fVar239;
          auVar110._16_4_ = auVar247._0_4_ + auVar94._0_4_ * fVar241;
          auVar110._20_4_ = auVar247._4_4_ + auVar94._4_4_ * fVar255;
          auVar110._24_4_ = auVar247._8_4_ + auVar94._8_4_ * fVar256;
          auVar110._28_4_ = auVar247._12_4_ + auVar94._12_4_;
          auVar106 = vsubps_avx(auVar183,auVar149);
          auVar150._0_4_ = auVar149._0_4_ + fVar207 * auVar106._0_4_;
          auVar150._4_4_ = auVar149._4_4_ + fVar235 * auVar106._4_4_;
          auVar150._8_4_ = auVar149._8_4_ + fVar237 * auVar106._8_4_;
          auVar150._12_4_ = auVar149._12_4_ + fVar239 * auVar106._12_4_;
          auVar150._16_4_ = auVar149._16_4_ + fVar241 * auVar106._16_4_;
          auVar150._20_4_ = auVar149._20_4_ + fVar255 * auVar106._20_4_;
          auVar150._24_4_ = auVar149._24_4_ + fVar256 * auVar106._24_4_;
          auVar150._28_4_ = auVar149._28_4_ + auVar106._28_4_;
          auVar106 = vsubps_avx(auVar110,auVar183);
          auVar111._0_4_ = auVar183._0_4_ + fVar207 * auVar106._0_4_;
          auVar111._4_4_ = auVar183._4_4_ + fVar235 * auVar106._4_4_;
          auVar111._8_4_ = auVar183._8_4_ + fVar237 * auVar106._8_4_;
          auVar111._12_4_ = auVar183._12_4_ + fVar239 * auVar106._12_4_;
          auVar111._16_4_ = auVar183._16_4_ + fVar241 * auVar106._16_4_;
          auVar111._20_4_ = auVar183._20_4_ + fVar255 * auVar106._20_4_;
          auVar111._24_4_ = auVar183._24_4_ + fVar256 * auVar106._24_4_;
          auVar111._28_4_ = auVar183._28_4_ + auVar106._28_4_;
          auVar106 = vsubps_avx(auVar111,auVar150);
          auVar265._0_4_ = auVar150._0_4_ + fVar207 * auVar106._0_4_;
          auVar265._4_4_ = auVar150._4_4_ + fVar235 * auVar106._4_4_;
          auVar265._8_4_ = auVar150._8_4_ + fVar237 * auVar106._8_4_;
          auVar265._12_4_ = auVar150._12_4_ + fVar239 * auVar106._12_4_;
          auVar269._16_4_ = auVar150._16_4_ + fVar241 * auVar106._16_4_;
          auVar269._0_16_ = auVar265;
          auVar269._20_4_ = auVar150._20_4_ + fVar255 * auVar106._20_4_;
          auVar269._24_4_ = auVar150._24_4_ + fVar256 * auVar106._24_4_;
          auVar269._28_4_ = auVar150._28_4_ + auVar183._28_4_;
          auVar270 = auVar269._16_16_;
          auVar130 = vshufps_avx(ZEXT416((uint)(fVar202 * 0.33333334)),
                                 ZEXT416((uint)(fVar202 * 0.33333334)),0);
          auVar225._0_4_ = auVar265._0_4_ + auVar130._0_4_ * auVar106._0_4_ * 3.0;
          auVar225._4_4_ = auVar265._4_4_ + auVar130._4_4_ * auVar106._4_4_ * 3.0;
          auVar225._8_4_ = auVar265._8_4_ + auVar130._8_4_ * auVar106._8_4_ * 3.0;
          auVar225._12_4_ = auVar265._12_4_ + auVar130._12_4_ * auVar106._12_4_ * 3.0;
          auVar180 = vshufpd_avx(auVar265,auVar265,3);
          auVar142 = vshufpd_avx(auVar270,auVar270,3);
          auVar94 = vsubps_avx(auVar180,auVar265);
          auVar290 = vsubps_avx(auVar142,auVar270);
          auVar92._0_4_ = auVar94._0_4_ + auVar290._0_4_;
          auVar92._4_4_ = auVar94._4_4_ + auVar290._4_4_;
          auVar92._8_4_ = auVar94._8_4_ + auVar290._8_4_;
          auVar92._12_4_ = auVar94._12_4_ + auVar290._12_4_;
          auVar94 = vmovshdup_avx(auVar265);
          auVar290 = vmovshdup_avx(auVar225);
          auVar166 = vshufps_avx(auVar92,auVar92,0);
          auVar131 = vshufps_avx(auVar92,auVar92,0x55);
          fVar207 = auVar131._0_4_;
          fVar235 = auVar131._4_4_;
          fVar237 = auVar131._8_4_;
          fVar239 = auVar131._12_4_;
          fVar241 = auVar166._0_4_;
          fVar255 = auVar166._4_4_;
          fVar256 = auVar166._8_4_;
          fVar257 = auVar166._12_4_;
          auVar93._0_4_ = fVar241 * auVar265._0_4_ + auVar94._0_4_ * fVar207;
          auVar93._4_4_ = fVar255 * auVar265._4_4_ + auVar94._4_4_ * fVar235;
          auVar93._8_4_ = fVar256 * auVar265._8_4_ + auVar94._8_4_ * fVar237;
          auVar93._12_4_ = fVar257 * auVar265._12_4_ + auVar94._12_4_ * fVar239;
          auVar330._0_4_ = fVar241 * auVar225._0_4_ + auVar290._0_4_ * fVar207;
          auVar330._4_4_ = fVar255 * auVar225._4_4_ + auVar290._4_4_ * fVar235;
          auVar330._8_4_ = fVar256 * auVar225._8_4_ + auVar290._8_4_ * fVar237;
          auVar330._12_4_ = fVar257 * auVar225._12_4_ + auVar290._12_4_ * fVar239;
          auVar290 = vshufps_avx(auVar93,auVar93,0xe8);
          auVar166 = vshufps_avx(auVar330,auVar330,0xe8);
          auVar94 = vcmpps_avx(auVar290,auVar166,1);
          uVar64 = vextractps_avx(auVar94,0);
          auVar131 = auVar330;
          if ((uVar64 & 1) == 0) {
            auVar131 = auVar93;
          }
          auVar129._0_4_ = auVar130._0_4_ * auVar106._16_4_ * 3.0;
          auVar129._4_4_ = auVar130._4_4_ * auVar106._20_4_ * 3.0;
          auVar129._8_4_ = auVar130._8_4_ * auVar106._24_4_ * 3.0;
          auVar129._12_4_ = auVar130._12_4_ * 0.0;
          auVar119 = vsubps_avx(auVar270,auVar129);
          auVar130 = vmovshdup_avx(auVar119);
          auVar270 = vmovshdup_avx(auVar270);
          fVar115 = auVar119._0_4_;
          fVar116 = auVar119._4_4_;
          auVar248._0_4_ = fVar115 * fVar241 + auVar130._0_4_ * fVar207;
          auVar248._4_4_ = fVar116 * fVar255 + auVar130._4_4_ * fVar235;
          auVar248._8_4_ = auVar119._8_4_ * fVar256 + auVar130._8_4_ * fVar237;
          auVar248._12_4_ = auVar119._12_4_ * fVar257 + auVar130._12_4_ * fVar239;
          auVar366._0_4_ = fVar241 * auVar269._16_4_ + auVar270._0_4_ * fVar207;
          auVar366._4_4_ = fVar255 * auVar269._20_4_ + auVar270._4_4_ * fVar235;
          auVar366._8_4_ = fVar256 * auVar269._24_4_ + auVar270._8_4_ * fVar237;
          auVar366._12_4_ = fVar257 * auVar269._28_4_ + auVar270._12_4_ * fVar239;
          auVar270 = vshufps_avx(auVar248,auVar248,0xe8);
          auVar16 = vshufps_avx(auVar366,auVar366,0xe8);
          auVar130 = vcmpps_avx(auVar270,auVar16,1);
          uVar64 = vextractps_avx(auVar130,0);
          auVar120 = auVar366;
          if ((uVar64 & 1) == 0) {
            auVar120 = auVar248;
          }
          auVar131 = vmaxss_avx(auVar120,auVar131);
          auVar290 = vminps_avx(auVar290,auVar166);
          auVar166 = vminps_avx(auVar270,auVar16);
          auVar166 = vminps_avx(auVar290,auVar166);
          auVar94 = vshufps_avx(auVar94,auVar94,0x55);
          auVar94 = vblendps_avx(auVar94,auVar130,2);
          auVar130 = vpslld_avx(auVar94,0x1f);
          auVar94 = vshufpd_avx(auVar330,auVar330,1);
          auVar94 = vinsertps_avx(auVar94,auVar366,0x9c);
          auVar290 = vshufpd_avx(auVar93,auVar93,1);
          auVar290 = vinsertps_avx(auVar290,auVar248,0x9c);
          auVar94 = vblendvps_avx(auVar290,auVar94,auVar130);
          auVar290 = vmovshdup_avx(auVar94);
          auVar94 = vmaxss_avx(auVar290,auVar94);
          fVar237 = auVar166._0_4_;
          auVar290 = vmovshdup_avx(auVar166);
          fVar235 = auVar94._0_4_;
          fVar239 = auVar290._0_4_;
          fVar207 = auVar131._0_4_;
          if ((fVar237 < 0.0001) && (-0.0001 < fVar235)) break;
          if ((fVar239 < 0.0001 && -0.0001 < fVar207) || (fVar237 < 0.0001 && -0.0001 < fVar207))
          break;
          auVar130 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar94,1);
          auVar290 = vcmpps_avx(auVar290,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar290 = vandps_avx(auVar290,auVar130);
        } while ((auVar290 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar130 = vcmpps_avx(auVar166,_DAT_01f45a50,1);
        auVar290 = vcmpss_avx(auVar131,ZEXT416(0) << 0x20,1);
        auVar165._8_4_ = 0x3f800000;
        auVar165._0_8_ = 0x3f8000003f800000;
        auVar165._12_4_ = 0x3f800000;
        auVar226._8_4_ = 0xbf800000;
        auVar226._0_8_ = 0xbf800000bf800000;
        auVar226._12_4_ = 0xbf800000;
        auVar290 = vblendvps_avx(auVar165,auVar226,auVar290);
        auVar130 = vblendvps_avx(auVar165,auVar226,auVar130);
        auVar166 = vcmpss_avx(auVar130,auVar290,4);
        auVar166 = vpshufd_avx(ZEXT416(auVar166._0_4_ & 1),0x50);
        auVar166 = vpslld_avx(auVar166,0x1f);
        auVar166 = vpsrad_avx(auVar166,0x1f);
        auVar166 = vpandn_avx(auVar166,_DAT_01f7afb0);
        auVar131 = vmovshdup_avx(auVar130);
        fVar241 = auVar131._0_4_;
        if ((auVar130._0_4_ != fVar241) || (NAN(auVar130._0_4_) || NAN(fVar241))) {
          if ((fVar239 != fVar237) || (NAN(fVar239) || NAN(fVar237))) {
            fVar237 = -fVar237 / (fVar239 - fVar237);
            auVar130 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar237) * 0.0 + fVar237)));
          }
          else {
            auVar130 = ZEXT816(0x3f80000000000000);
            if ((fVar237 != 0.0) || (NAN(fVar237))) {
              auVar130 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar270 = vcmpps_avx(auVar166,auVar130,1);
          auVar131 = vblendps_avx(auVar166,auVar130,2);
          auVar130 = vblendps_avx(auVar130,auVar166,2);
          auVar166 = vblendvps_avx(auVar130,auVar131,auVar270);
        }
        auVar94 = vcmpss_avx(auVar94,ZEXT416(0) << 0x20,1);
        auVar167._8_4_ = 0x3f800000;
        auVar167._0_8_ = 0x3f8000003f800000;
        auVar167._12_4_ = 0x3f800000;
        auVar227._8_4_ = 0xbf800000;
        auVar227._0_8_ = 0xbf800000bf800000;
        auVar227._12_4_ = 0xbf800000;
        auVar94 = vblendvps_avx(auVar167,auVar227,auVar94);
        fVar237 = auVar94._0_4_;
        if ((auVar290._0_4_ != fVar237) || (NAN(auVar290._0_4_) || NAN(fVar237))) {
          if ((fVar235 != fVar207) || (NAN(fVar235) || NAN(fVar207))) {
            fVar207 = -fVar207 / (fVar235 - fVar207);
            auVar94 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar207) * 0.0 + fVar207)));
          }
          else {
            auVar94 = ZEXT816(0x3f80000000000000);
            if ((fVar207 != 0.0) || (NAN(fVar207))) {
              auVar94 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar130 = vcmpps_avx(auVar166,auVar94,1);
          auVar290 = vblendps_avx(auVar166,auVar94,2);
          auVar94 = vblendps_avx(auVar94,auVar166,2);
          auVar166 = vblendvps_avx(auVar94,auVar290,auVar130);
        }
        if ((fVar241 != fVar237) || (NAN(fVar241) || NAN(fVar237))) {
          auVar95._8_4_ = 0x3f800000;
          auVar95._0_8_ = 0x3f8000003f800000;
          auVar95._12_4_ = 0x3f800000;
          auVar94 = vcmpps_avx(auVar166,auVar95,1);
          auVar290 = vinsertps_avx(auVar166,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar168._4_12_ = auVar166._4_12_;
          auVar168._0_4_ = 0x3f800000;
          auVar166 = vblendvps_avx(auVar168,auVar290,auVar94);
        }
        auVar94 = vcmpps_avx(auVar166,_DAT_01f46740,1);
        auVar55._12_4_ = 0;
        auVar55._0_12_ = auVar166._4_12_;
        auVar290 = vinsertps_avx(auVar166,ZEXT416(0x3f800000),0x10);
        auVar94 = vblendvps_avx(auVar290,auVar55 << 0x20,auVar94);
        auVar290 = vmovshdup_avx(auVar94);
      } while (auVar290._0_4_ < auVar94._0_4_);
      auVar96._0_4_ = auVar94._0_4_ + -0.1;
      auVar96._4_4_ = auVar94._4_4_ + 0.1;
      auVar96._8_4_ = auVar94._8_4_ + 0.0;
      auVar96._12_4_ = auVar94._12_4_ + 0.0;
      auVar130 = vshufpd_avx(auVar225,auVar225,3);
      auVar266._8_8_ = 0x3f80000000000000;
      auVar266._0_8_ = 0x3f80000000000000;
      auVar94 = vcmpps_avx(auVar96,auVar266,1);
      auVar53._12_4_ = 0;
      auVar53._0_12_ = auVar96._4_12_;
      auVar290 = vinsertps_avx(auVar96,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar94 = vblendvps_avx(auVar290,auVar53 << 0x20,auVar94);
      auVar290 = vshufpd_avx(auVar119,auVar119,3);
      auVar166 = vshufps_avx(auVar94,auVar94,0x50);
      auVar267._8_4_ = 0x3f800000;
      auVar267._0_8_ = 0x3f8000003f800000;
      auVar267._12_4_ = 0x3f800000;
      auVar131 = vsubps_avx(auVar267,auVar166);
      local_600 = auVar180._0_4_;
      fStack_5fc = auVar180._4_4_;
      fStack_5f8 = auVar180._8_4_;
      fStack_5f4 = auVar180._12_4_;
      fVar207 = auVar166._0_4_;
      fVar235 = auVar166._4_4_;
      fVar237 = auVar166._8_4_;
      fVar239 = auVar166._12_4_;
      local_680 = auVar142._0_4_;
      fStack_67c = auVar142._4_4_;
      fStack_678 = auVar142._8_4_;
      fStack_674 = auVar142._12_4_;
      fVar241 = auVar131._0_4_;
      fVar255 = auVar131._4_4_;
      fVar256 = auVar131._8_4_;
      fVar257 = auVar131._12_4_;
      auVar97._0_4_ = fVar207 * local_600 + fVar241 * auVar265._0_4_;
      auVar97._4_4_ = fVar235 * fStack_5fc + fVar255 * auVar265._4_4_;
      auVar97._8_4_ = fVar237 * fStack_5f8 + fVar256 * auVar265._0_4_;
      auVar97._12_4_ = fVar239 * fStack_5f4 + fVar257 * auVar265._4_4_;
      auVar249._0_4_ = auVar130._0_4_ * fVar207 + fVar241 * auVar225._0_4_;
      auVar249._4_4_ = auVar130._4_4_ * fVar235 + fVar255 * auVar225._4_4_;
      auVar249._8_4_ = auVar130._8_4_ * fVar237 + fVar256 * auVar225._0_4_;
      auVar249._12_4_ = auVar130._12_4_ * fVar239 + fVar257 * auVar225._4_4_;
      auVar280._0_4_ = auVar290._0_4_ * fVar207 + fVar241 * fVar115;
      auVar280._4_4_ = auVar290._4_4_ * fVar235 + fVar255 * fVar116;
      auVar280._8_4_ = auVar290._8_4_ * fVar237 + fVar256 * fVar115;
      auVar280._12_4_ = auVar290._12_4_ * fVar239 + fVar257 * fVar116;
      auVar322._0_4_ = fVar207 * local_680 + fVar241 * auVar269._16_4_;
      auVar322._4_4_ = fVar235 * fStack_67c + fVar255 * auVar269._20_4_;
      auVar322._8_4_ = fVar237 * fStack_678 + fVar256 * auVar269._16_4_;
      auVar322._12_4_ = fVar239 * fStack_674 + fVar257 * auVar269._20_4_;
      auVar142 = vsubps_avx(auVar267,auVar94);
      auVar290 = vmovshdup_avx(auVar329);
      auVar180 = vmovsldup_avx(auVar329);
      auVar268._0_4_ = auVar142._0_4_ * auVar180._0_4_ + auVar94._0_4_ * auVar290._0_4_;
      auVar268._4_4_ = auVar142._4_4_ * auVar180._4_4_ + auVar94._4_4_ * auVar290._4_4_;
      auVar268._8_4_ = auVar142._8_4_ * auVar180._8_4_ + auVar94._8_4_ * auVar290._8_4_;
      auVar268._12_4_ = auVar142._12_4_ * auVar180._12_4_ + auVar94._12_4_ * auVar290._12_4_;
      auVar119 = vmovshdup_avx(auVar268);
      auVar94 = vsubps_avx(auVar249,auVar97);
      auVar169._0_4_ = auVar94._0_4_ * 3.0;
      auVar169._4_4_ = auVar94._4_4_ * 3.0;
      auVar169._8_4_ = auVar94._8_4_ * 3.0;
      auVar169._12_4_ = auVar94._12_4_ * 3.0;
      auVar94 = vsubps_avx(auVar280,auVar249);
      auVar196._0_4_ = auVar94._0_4_ * 3.0;
      auVar196._4_4_ = auVar94._4_4_ * 3.0;
      auVar196._8_4_ = auVar94._8_4_ * 3.0;
      auVar196._12_4_ = auVar94._12_4_ * 3.0;
      auVar94 = vsubps_avx(auVar322,auVar280);
      auVar293._0_4_ = auVar94._0_4_ * 3.0;
      auVar293._4_4_ = auVar94._4_4_ * 3.0;
      auVar293._8_4_ = auVar94._8_4_ * 3.0;
      auVar293._12_4_ = auVar94._12_4_ * 3.0;
      auVar290 = vminps_avx(auVar196,auVar293);
      auVar94 = vmaxps_avx(auVar196,auVar293);
      auVar290 = vminps_avx(auVar169,auVar290);
      auVar94 = vmaxps_avx(auVar169,auVar94);
      auVar180 = vshufpd_avx(auVar290,auVar290,3);
      auVar142 = vshufpd_avx(auVar94,auVar94,3);
      auVar290 = vminps_avx(auVar290,auVar180);
      auVar94 = vmaxps_avx(auVar94,auVar142);
      auVar180 = vshufps_avx(ZEXT416((uint)(1.0 / fVar202)),ZEXT416((uint)(1.0 / fVar202)),0);
      auVar294._0_4_ = auVar180._0_4_ * auVar290._0_4_;
      auVar294._4_4_ = auVar180._4_4_ * auVar290._4_4_;
      auVar294._8_4_ = auVar180._8_4_ * auVar290._8_4_;
      auVar294._12_4_ = auVar180._12_4_ * auVar290._12_4_;
      auVar308._0_4_ = auVar180._0_4_ * auVar94._0_4_;
      auVar308._4_4_ = auVar180._4_4_ * auVar94._4_4_;
      auVar308._8_4_ = auVar180._8_4_ * auVar94._8_4_;
      auVar308._12_4_ = auVar180._12_4_ * auVar94._12_4_;
      auVar131 = ZEXT416((uint)(1.0 / (auVar119._0_4_ - auVar268._0_4_)));
      auVar94 = vshufpd_avx(auVar97,auVar97,3);
      auVar290 = vshufpd_avx(auVar249,auVar249,3);
      auVar180 = vshufpd_avx(auVar280,auVar280,3);
      auVar142 = vshufpd_avx(auVar322,auVar322,3);
      auVar94 = vsubps_avx(auVar94,auVar97);
      auVar130 = vsubps_avx(auVar290,auVar249);
      auVar166 = vsubps_avx(auVar180,auVar280);
      auVar142 = vsubps_avx(auVar142,auVar322);
      auVar290 = vminps_avx(auVar94,auVar130);
      auVar94 = vmaxps_avx(auVar94,auVar130);
      auVar180 = vminps_avx(auVar166,auVar142);
      auVar180 = vminps_avx(auVar290,auVar180);
      auVar290 = vmaxps_avx(auVar166,auVar142);
      auVar94 = vmaxps_avx(auVar94,auVar290);
      auVar290 = vshufps_avx(auVar131,auVar131,0);
      auVar354._0_4_ = auVar290._0_4_ * auVar180._0_4_;
      auVar354._4_4_ = auVar290._4_4_ * auVar180._4_4_;
      auVar354._8_4_ = auVar290._8_4_ * auVar180._8_4_;
      auVar354._12_4_ = auVar290._12_4_ * auVar180._12_4_;
      auVar362._0_4_ = auVar290._0_4_ * auVar94._0_4_;
      auVar362._4_4_ = auVar290._4_4_ * auVar94._4_4_;
      auVar362._8_4_ = auVar290._8_4_ * auVar94._8_4_;
      auVar362._12_4_ = auVar290._12_4_ * auVar94._12_4_;
      auVar94 = vmovsldup_avx(auVar268);
      auVar323._4_12_ = auVar94._4_12_;
      auVar323._0_4_ = fVar204;
      auVar331._4_12_ = auVar268._4_12_;
      auVar331._0_4_ = fVar200;
      auVar197._0_4_ = (fVar204 + fVar200) * 0.5;
      auVar197._4_4_ = (auVar94._4_4_ + auVar268._4_4_) * 0.5;
      auVar197._8_4_ = (auVar94._8_4_ + auVar268._8_4_) * 0.5;
      auVar197._12_4_ = (auVar94._12_4_ + auVar268._12_4_) * 0.5;
      auVar94 = vshufps_avx(auVar197,auVar197,0);
      fVar207 = auVar94._0_4_;
      fVar235 = auVar94._4_4_;
      fVar237 = auVar94._8_4_;
      fVar239 = auVar94._12_4_;
      local_6b0._0_4_ = auVar319._0_4_;
      local_6b0._4_4_ = auVar319._4_4_;
      fStack_6a8 = auVar319._8_4_;
      fStack_6a4 = auVar319._12_4_;
      auVar132._0_4_ = fVar207 * (float)local_350._0_4_ + (float)local_6b0._0_4_;
      auVar132._4_4_ = fVar235 * (float)local_350._4_4_ + (float)local_6b0._4_4_;
      auVar132._8_4_ = fVar237 * fStack_348 + fStack_6a8;
      auVar132._12_4_ = fVar239 * fStack_344 + fStack_6a4;
      local_630 = auVar15._0_4_;
      fStack_62c = auVar15._4_4_;
      fStack_628 = auVar15._8_4_;
      fStack_624 = auVar15._12_4_;
      auVar170._0_4_ = fVar207 * (float)local_360._0_4_ + local_630;
      auVar170._4_4_ = fVar235 * (float)local_360._4_4_ + fStack_62c;
      auVar170._8_4_ = fVar237 * fStack_358 + fStack_628;
      auVar170._12_4_ = fVar239 * fStack_354 + fStack_624;
      local_640 = auVar214._0_4_;
      fStack_63c = auVar214._4_4_;
      fStack_638 = auVar214._8_4_;
      fStack_634 = auVar214._12_4_;
      auVar250._0_4_ = fVar207 * (float)local_370._0_4_ + local_640;
      auVar250._4_4_ = fVar235 * (float)local_370._4_4_ + fStack_63c;
      auVar250._8_4_ = fVar237 * fStack_368 + fStack_638;
      auVar250._12_4_ = fVar239 * fStack_364 + fStack_634;
      auVar94 = vsubps_avx(auVar170,auVar132);
      auVar133._0_4_ = auVar132._0_4_ + fVar207 * auVar94._0_4_;
      auVar133._4_4_ = auVar132._4_4_ + fVar235 * auVar94._4_4_;
      auVar133._8_4_ = auVar132._8_4_ + fVar237 * auVar94._8_4_;
      auVar133._12_4_ = auVar132._12_4_ + fVar239 * auVar94._12_4_;
      auVar94 = vsubps_avx(auVar250,auVar170);
      auVar171._0_4_ = auVar170._0_4_ + fVar207 * auVar94._0_4_;
      auVar171._4_4_ = auVar170._4_4_ + fVar235 * auVar94._4_4_;
      auVar171._8_4_ = auVar170._8_4_ + fVar237 * auVar94._8_4_;
      auVar171._12_4_ = auVar170._12_4_ + fVar239 * auVar94._12_4_;
      auVar94 = vsubps_avx(auVar171,auVar133);
      fVar207 = auVar133._0_4_ + fVar207 * auVar94._0_4_;
      fVar235 = auVar133._4_4_ + fVar235 * auVar94._4_4_;
      auVar98._0_8_ = CONCAT44(fVar235,fVar207);
      auVar98._8_4_ = auVar133._8_4_ + fVar237 * auVar94._8_4_;
      auVar98._12_4_ = auVar133._12_4_ + fVar239 * auVar94._12_4_;
      fVar237 = auVar94._0_4_ * 3.0;
      fVar239 = auVar94._4_4_ * 3.0;
      auVar134._0_8_ = CONCAT44(fVar239,fVar237);
      auVar134._8_4_ = auVar94._8_4_ * 3.0;
      auVar134._12_4_ = auVar94._12_4_ * 3.0;
      auVar172._8_8_ = auVar98._0_8_;
      auVar172._0_8_ = auVar98._0_8_;
      auVar94 = vshufpd_avx(auVar98,auVar98,3);
      auVar290 = vshufps_avx(auVar197,auVar197,0x55);
      auVar166 = vsubps_avx(auVar94,auVar172);
      auVar341._0_4_ = auVar166._0_4_ * auVar290._0_4_ + fVar207;
      auVar341._4_4_ = auVar166._4_4_ * auVar290._4_4_ + fVar235;
      auVar341._8_4_ = auVar166._8_4_ * auVar290._8_4_ + fVar207;
      auVar341._12_4_ = auVar166._12_4_ * auVar290._12_4_ + fVar235;
      auVar173._8_8_ = auVar134._0_8_;
      auVar173._0_8_ = auVar134._0_8_;
      auVar94 = vshufpd_avx(auVar134,auVar134,1);
      auVar94 = vsubps_avx(auVar94,auVar173);
      auVar135._0_4_ = auVar94._0_4_ * auVar290._0_4_ + fVar237;
      auVar135._4_4_ = auVar94._4_4_ * auVar290._4_4_ + fVar239;
      auVar135._8_4_ = auVar94._8_4_ * auVar290._8_4_ + fVar237;
      auVar135._12_4_ = auVar94._12_4_ * auVar290._12_4_ + fVar239;
      auVar290 = vmovshdup_avx(auVar135);
      auVar251._0_8_ = auVar290._0_8_ ^ 0x8000000080000000;
      auVar251._8_4_ = auVar290._8_4_ ^ 0x80000000;
      auVar251._12_4_ = auVar290._12_4_ ^ 0x80000000;
      auVar180 = vmovshdup_avx(auVar166);
      auVar94 = vunpcklps_avx(auVar180,auVar251);
      auVar142 = vshufps_avx(auVar94,auVar251,4);
      auVar99._0_8_ = auVar166._0_8_ ^ 0x8000000080000000;
      auVar99._8_4_ = -auVar166._8_4_;
      auVar99._12_4_ = -auVar166._12_4_;
      auVar94 = vmovlhps_avx(auVar99,auVar135);
      auVar130 = vshufps_avx(auVar94,auVar135,8);
      auVar94 = ZEXT416((uint)(auVar135._0_4_ * auVar180._0_4_ - auVar166._0_4_ * auVar290._0_4_));
      auVar290 = vshufps_avx(auVar94,auVar94,0);
      auVar94 = vdivps_avx(auVar142,auVar290);
      auVar290 = vdivps_avx(auVar130,auVar290);
      auVar130 = vinsertps_avx(auVar294,auVar354,0x1c);
      auVar166 = vinsertps_avx(auVar308,auVar362,0x1c);
      auVar131 = vinsertps_avx(auVar354,auVar294,0x4c);
      auVar270 = vinsertps_avx(auVar362,auVar308,0x4c);
      auVar180 = vmovsldup_avx(auVar94);
      auVar174._0_4_ = auVar180._0_4_ * auVar130._0_4_;
      auVar174._4_4_ = auVar180._4_4_ * auVar130._4_4_;
      auVar174._8_4_ = auVar180._8_4_ * auVar130._8_4_;
      auVar174._12_4_ = auVar180._12_4_ * auVar130._12_4_;
      auVar136._0_4_ = auVar166._0_4_ * auVar180._0_4_;
      auVar136._4_4_ = auVar166._4_4_ * auVar180._4_4_;
      auVar136._8_4_ = auVar166._8_4_ * auVar180._8_4_;
      auVar136._12_4_ = auVar166._12_4_ * auVar180._12_4_;
      auVar142 = vminps_avx(auVar174,auVar136);
      auVar180 = vmaxps_avx(auVar136,auVar174);
      auVar16 = vmovsldup_avx(auVar290);
      auVar363._0_4_ = auVar131._0_4_ * auVar16._0_4_;
      auVar363._4_4_ = auVar131._4_4_ * auVar16._4_4_;
      auVar363._8_4_ = auVar131._8_4_ * auVar16._8_4_;
      auVar363._12_4_ = auVar131._12_4_ * auVar16._12_4_;
      auVar175._0_4_ = auVar270._0_4_ * auVar16._0_4_;
      auVar175._4_4_ = auVar270._4_4_ * auVar16._4_4_;
      auVar175._8_4_ = auVar270._8_4_ * auVar16._8_4_;
      auVar175._12_4_ = auVar270._12_4_ * auVar16._12_4_;
      auVar16 = vminps_avx(auVar363,auVar175);
      auVar228._0_4_ = auVar142._0_4_ + auVar16._0_4_;
      auVar228._4_4_ = auVar142._4_4_ + auVar16._4_4_;
      auVar228._8_4_ = auVar142._8_4_ + auVar16._8_4_;
      auVar228._12_4_ = auVar142._12_4_ + auVar16._12_4_;
      auVar142 = vmaxps_avx(auVar175,auVar363);
      auVar16 = vsubps_avx(auVar323,auVar197);
      auVar120 = vsubps_avx(auVar331,auVar197);
      auVar137._0_4_ = auVar180._0_4_ + auVar142._0_4_;
      auVar137._4_4_ = auVar180._4_4_ + auVar142._4_4_;
      auVar137._8_4_ = auVar180._8_4_ + auVar142._8_4_;
      auVar137._12_4_ = auVar180._12_4_ + auVar142._12_4_;
      auVar176._8_8_ = 0x3f800000;
      auVar176._0_8_ = 0x3f800000;
      auVar180 = vsubps_avx(auVar176,auVar137);
      auVar142 = vsubps_avx(auVar176,auVar228);
      fVar256 = auVar16._0_4_;
      auVar229._0_4_ = fVar256 * auVar180._0_4_;
      fVar257 = auVar16._4_4_;
      auVar229._4_4_ = fVar257 * auVar180._4_4_;
      fVar115 = auVar16._8_4_;
      auVar229._8_4_ = fVar115 * auVar180._8_4_;
      fVar116 = auVar16._12_4_;
      auVar229._12_4_ = fVar116 * auVar180._12_4_;
      fVar237 = auVar120._0_4_;
      auVar138._0_4_ = fVar237 * auVar180._0_4_;
      fVar239 = auVar120._4_4_;
      auVar138._4_4_ = fVar239 * auVar180._4_4_;
      fVar241 = auVar120._8_4_;
      auVar138._8_4_ = fVar241 * auVar180._8_4_;
      fVar255 = auVar120._12_4_;
      auVar138._12_4_ = fVar255 * auVar180._12_4_;
      auVar324._0_4_ = fVar256 * auVar142._0_4_;
      auVar324._4_4_ = fVar257 * auVar142._4_4_;
      auVar324._8_4_ = fVar115 * auVar142._8_4_;
      auVar324._12_4_ = fVar116 * auVar142._12_4_;
      auVar177._0_4_ = fVar237 * auVar142._0_4_;
      auVar177._4_4_ = fVar239 * auVar142._4_4_;
      auVar177._8_4_ = fVar241 * auVar142._8_4_;
      auVar177._12_4_ = fVar255 * auVar142._12_4_;
      auVar180 = vminps_avx(auVar229,auVar324);
      auVar142 = vminps_avx(auVar138,auVar177);
      auVar16 = vminps_avx(auVar180,auVar142);
      auVar180 = vmaxps_avx(auVar324,auVar229);
      auVar142 = vmaxps_avx(auVar177,auVar138);
      auVar120 = vshufps_avx(auVar197,auVar197,0x54);
      auVar142 = vmaxps_avx(auVar142,auVar180);
      auVar121 = vshufps_avx(auVar341,auVar341,0);
      auVar153 = vshufps_avx(auVar341,auVar341,0x55);
      auVar180 = vhaddps_avx(auVar16,auVar16);
      auVar142 = vhaddps_avx(auVar142,auVar142);
      auVar198._0_4_ = auVar121._0_4_ * auVar94._0_4_ + auVar153._0_4_ * auVar290._0_4_;
      auVar198._4_4_ = auVar121._4_4_ * auVar94._4_4_ + auVar153._4_4_ * auVar290._4_4_;
      auVar198._8_4_ = auVar121._8_4_ * auVar94._8_4_ + auVar153._8_4_ * auVar290._8_4_;
      auVar198._12_4_ = auVar121._12_4_ * auVar94._12_4_ + auVar153._12_4_ * auVar290._12_4_;
      auVar16 = vsubps_avx(auVar120,auVar198);
      fVar207 = auVar16._0_4_ + auVar180._0_4_;
      fVar235 = auVar16._0_4_ + auVar142._0_4_;
      auVar180 = vmaxss_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar207));
      auVar142 = vminss_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar200));
    } while (auVar142._0_4_ < auVar180._0_4_);
    auVar180 = vmovshdup_avx(auVar94);
    auVar100._0_4_ = auVar180._0_4_ * auVar130._0_4_;
    auVar100._4_4_ = auVar180._4_4_ * auVar130._4_4_;
    auVar100._8_4_ = auVar180._8_4_ * auVar130._8_4_;
    auVar100._12_4_ = auVar180._12_4_ * auVar130._12_4_;
    auVar139._0_4_ = auVar166._0_4_ * auVar180._0_4_;
    auVar139._4_4_ = auVar166._4_4_ * auVar180._4_4_;
    auVar139._8_4_ = auVar166._8_4_ * auVar180._8_4_;
    auVar139._12_4_ = auVar166._12_4_ * auVar180._12_4_;
    auVar142 = vminps_avx(auVar100,auVar139);
    auVar180 = vmaxps_avx(auVar139,auVar100);
    auVar130 = vmovshdup_avx(auVar290);
    auVar230._0_4_ = auVar131._0_4_ * auVar130._0_4_;
    auVar230._4_4_ = auVar131._4_4_ * auVar130._4_4_;
    auVar230._8_4_ = auVar131._8_4_ * auVar130._8_4_;
    auVar230._12_4_ = auVar131._12_4_ * auVar130._12_4_;
    auVar140._0_4_ = auVar270._0_4_ * auVar130._0_4_;
    auVar140._4_4_ = auVar270._4_4_ * auVar130._4_4_;
    auVar140._8_4_ = auVar270._8_4_ * auVar130._8_4_;
    auVar140._12_4_ = auVar270._12_4_ * auVar130._12_4_;
    auVar130 = vminps_avx(auVar230,auVar140);
    auVar178._0_4_ = auVar142._0_4_ + auVar130._0_4_;
    auVar178._4_4_ = auVar142._4_4_ + auVar130._4_4_;
    auVar178._8_4_ = auVar142._8_4_ + auVar130._8_4_;
    auVar178._12_4_ = auVar142._12_4_ + auVar130._12_4_;
    auVar142 = vmaxps_avx(auVar140,auVar230);
    auVar101._0_4_ = auVar180._0_4_ + auVar142._0_4_;
    auVar101._4_4_ = auVar180._4_4_ + auVar142._4_4_;
    auVar101._8_4_ = auVar180._8_4_ + auVar142._8_4_;
    auVar101._12_4_ = auVar180._12_4_ + auVar142._12_4_;
    auVar180 = vsubps_avx(auVar266,auVar101);
    auVar142 = vsubps_avx(auVar266,auVar178);
    auVar179._0_4_ = fVar256 * auVar180._0_4_;
    auVar179._4_4_ = fVar257 * auVar180._4_4_;
    auVar179._8_4_ = fVar115 * auVar180._8_4_;
    auVar179._12_4_ = fVar116 * auVar180._12_4_;
    auVar231._0_4_ = fVar256 * auVar142._0_4_;
    auVar231._4_4_ = fVar257 * auVar142._4_4_;
    auVar231._8_4_ = fVar115 * auVar142._8_4_;
    auVar231._12_4_ = fVar116 * auVar142._12_4_;
    auVar102._0_4_ = fVar237 * auVar180._0_4_;
    auVar102._4_4_ = fVar239 * auVar180._4_4_;
    auVar102._8_4_ = fVar241 * auVar180._8_4_;
    auVar102._12_4_ = fVar255 * auVar180._12_4_;
    auVar141._0_4_ = fVar237 * auVar142._0_4_;
    auVar141._4_4_ = fVar239 * auVar142._4_4_;
    auVar141._8_4_ = fVar241 * auVar142._8_4_;
    auVar141._12_4_ = fVar255 * auVar142._12_4_;
    auVar180 = vminps_avx(auVar179,auVar231);
    auVar142 = vminps_avx(auVar102,auVar141);
    auVar180 = vminps_avx(auVar180,auVar142);
    auVar142 = vmaxps_avx(auVar231,auVar179);
    auVar130 = vmaxps_avx(auVar141,auVar102);
    auVar180 = vhaddps_avx(auVar180,auVar180);
    auVar142 = vmaxps_avx(auVar130,auVar142);
    auVar142 = vhaddps_avx(auVar142,auVar142);
    auVar130 = vmovshdup_avx(auVar16);
    auVar166 = ZEXT416((uint)(auVar130._0_4_ + auVar180._0_4_));
    auVar180 = vmaxss_avx(auVar268,auVar166);
    auVar130 = ZEXT416((uint)(auVar130._0_4_ + auVar142._0_4_));
    auVar142 = vminss_avx(auVar130,auVar119);
  } while (auVar142._0_4_ < auVar180._0_4_);
  bVar71 = 0;
  if ((fVar204 < fVar207) && (fVar235 < fVar200)) {
    auVar180 = vcmpps_avx(auVar130,auVar119,1);
    auVar142 = vcmpps_avx(auVar268,auVar166,1);
    auVar180 = vandps_avx(auVar142,auVar180);
    bVar71 = auVar180[0];
  }
  auVar295._8_4_ = 0x7fffffff;
  auVar295._0_8_ = 0x7fffffff7fffffff;
  auVar295._12_4_ = 0x7fffffff;
  if (((uint)uVar69 < 4 && 0.001 <= fVar202) && (bVar71 & 1) == 0) goto LAB_008f16dc;
  lVar68 = 0xc9;
  do {
    lVar68 = lVar68 + -1;
    if (lVar68 == 0) goto LAB_008f06d6;
    fVar202 = auVar16._0_4_;
    fVar200 = 1.0 - fVar202;
    auVar180 = ZEXT416((uint)(fVar200 * fVar200 * fVar200));
    auVar180 = vshufps_avx(auVar180,auVar180,0);
    auVar142 = ZEXT416((uint)(fVar202 * 3.0 * fVar200 * fVar200));
    auVar142 = vshufps_avx(auVar142,auVar142,0);
    auVar130 = ZEXT416((uint)(fVar200 * fVar202 * fVar202 * 3.0));
    auVar130 = vshufps_avx(auVar130,auVar130,0);
    auVar166 = ZEXT416((uint)(fVar202 * fVar202 * fVar202));
    auVar166 = vshufps_avx(auVar166,auVar166,0);
    fVar200 = (float)local_6b0._0_4_ * auVar180._0_4_ +
              local_630 * auVar142._0_4_ +
              (float)local_380._0_4_ * auVar166._0_4_ + local_640 * auVar130._0_4_;
    fVar202 = (float)local_6b0._4_4_ * auVar180._4_4_ +
              fStack_62c * auVar142._4_4_ +
              (float)local_380._4_4_ * auVar166._4_4_ + fStack_63c * auVar130._4_4_;
    auVar103._0_8_ = CONCAT44(fVar202,fVar200);
    auVar103._8_4_ =
         fStack_6a8 * auVar180._8_4_ +
         fStack_628 * auVar142._8_4_ + fStack_378 * auVar166._8_4_ + fStack_638 * auVar130._8_4_;
    auVar103._12_4_ =
         fStack_6a4 * auVar180._12_4_ +
         fStack_624 * auVar142._12_4_ + fStack_374 * auVar166._12_4_ + fStack_634 * auVar130._12_4_;
    auVar143._8_8_ = auVar103._0_8_;
    auVar143._0_8_ = auVar103._0_8_;
    auVar142 = vshufpd_avx(auVar103,auVar103,1);
    auVar180 = vmovshdup_avx(auVar16);
    auVar142 = vsubps_avx(auVar142,auVar143);
    auVar104._0_4_ = auVar180._0_4_ * auVar142._0_4_ + fVar200;
    auVar104._4_4_ = auVar180._4_4_ * auVar142._4_4_ + fVar202;
    auVar104._8_4_ = auVar180._8_4_ * auVar142._8_4_ + fVar200;
    auVar104._12_4_ = auVar180._12_4_ * auVar142._12_4_ + fVar202;
    auVar180 = vshufps_avx(auVar104,auVar104,0);
    auVar142 = vshufps_avx(auVar104,auVar104,0x55);
    auVar144._0_4_ = auVar94._0_4_ * auVar180._0_4_ + auVar290._0_4_ * auVar142._0_4_;
    auVar144._4_4_ = auVar94._4_4_ * auVar180._4_4_ + auVar290._4_4_ * auVar142._4_4_;
    auVar144._8_4_ = auVar94._8_4_ * auVar180._8_4_ + auVar290._8_4_ * auVar142._8_4_;
    auVar144._12_4_ = auVar94._12_4_ * auVar180._12_4_ + auVar290._12_4_ * auVar142._12_4_;
    auVar16 = vsubps_avx(auVar16,auVar144);
    auVar180 = vandps_avx(auVar295,auVar104);
    auVar142 = vshufps_avx(auVar180,auVar180,0xf5);
    auVar180 = vmaxss_avx(auVar142,auVar180);
  } while ((float)local_390._0_4_ <= auVar180._0_4_);
  fVar200 = auVar16._0_4_;
  if ((fVar200 < 0.0) || (1.0 < fVar200)) goto LAB_008f06d6;
  auVar94 = vmovshdup_avx(auVar16);
  fVar202 = auVar94._0_4_;
  if ((fVar202 < 0.0) || (1.0 < fVar202)) goto LAB_008f06d6;
  auVar94 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar270 = vinsertps_avx(auVar94,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar94 = vdpps_avx(auVar270,local_3a0,0x7f);
  auVar290 = vdpps_avx(auVar270,local_3b0,0x7f);
  auVar180 = vdpps_avx(auVar270,local_3e0,0x7f);
  auVar142 = vdpps_avx(auVar270,local_3f0,0x7f);
  auVar130 = vdpps_avx(auVar270,local_400,0x7f);
  auVar166 = vdpps_avx(auVar270,local_410,0x7f);
  fVar239 = 1.0 - fVar202;
  auVar131 = vdpps_avx(auVar270,local_3c0,0x7f);
  auVar270 = vdpps_avx(auVar270,local_3d0,0x7f);
  fVar241 = 1.0 - fVar200;
  fVar204 = auVar16._4_4_;
  fVar207 = auVar16._8_4_;
  fVar235 = auVar16._12_4_;
  fVar237 = fVar241 * fVar200 * fVar200 * 3.0;
  auVar252._0_4_ = fVar200 * fVar200 * fVar200;
  auVar252._4_4_ = fVar204 * fVar204 * fVar204;
  auVar252._8_4_ = fVar207 * fVar207 * fVar207;
  auVar252._12_4_ = fVar235 * fVar235 * fVar235;
  fVar204 = fVar200 * 3.0 * fVar241 * fVar241;
  fVar207 = fVar241 * fVar241 * fVar241;
  fVar200 = (fVar239 * auVar94._0_4_ + fVar202 * auVar180._0_4_) * fVar207 +
            (fVar239 * auVar290._0_4_ + fVar202 * auVar142._0_4_) * fVar204 +
            fVar237 * (fVar239 * auVar131._0_4_ + fVar202 * auVar130._0_4_) +
            auVar252._0_4_ * (auVar166._0_4_ * fVar202 + fVar239 * auVar270._0_4_);
  if ((fVar200 < fVar185) || (fVar202 = *(float *)(ray + k * 4 + 0x100), fVar202 < fVar200))
  goto LAB_008f06d6;
  pGVar9 = (context->scene->geometries).items[uVar65].ptr;
  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar71 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_008f16bf;
    local_f0 = vshufps_avx(auVar16,auVar16,0x55);
    auVar296._8_4_ = 0x3f800000;
    auVar296._0_8_ = 0x3f8000003f800000;
    auVar296._12_4_ = 0x3f800000;
    auVar94 = vsubps_avx(auVar296,local_f0);
    fVar235 = local_f0._0_4_;
    fVar239 = local_f0._4_4_;
    fVar255 = local_f0._8_4_;
    fVar256 = local_f0._12_4_;
    fVar257 = auVar94._0_4_;
    fVar115 = auVar94._4_4_;
    fVar116 = auVar94._8_4_;
    fVar117 = auVar94._12_4_;
    auVar309._0_4_ = fVar235 * (float)local_4f0._0_4_ + fVar257 * (float)local_4c0._0_4_;
    auVar309._4_4_ = fVar239 * (float)local_4f0._4_4_ + fVar115 * (float)local_4c0._4_4_;
    auVar309._8_4_ = fVar255 * fStack_4e8 + fVar116 * fStack_4b8;
    auVar309._12_4_ = fVar256 * fStack_4e4 + fVar117 * fStack_4b4;
    auVar325._0_4_ = fVar235 * fVar77 + fVar257 * fVar76;
    auVar325._4_4_ = fVar239 * fVar203 + fVar115 * fVar201;
    auVar325._8_4_ = fVar255 * fVar236 + fVar116 * fVar208;
    auVar325._12_4_ = fVar256 * fVar113 + fVar117 * fVar240;
    auVar332._0_4_ = fVar235 * fVar186 + fVar257 * (float)local_4d0._0_4_;
    auVar332._4_4_ = fVar239 * fVar205 + fVar115 * (float)local_4d0._4_4_;
    auVar332._8_4_ = fVar255 * fVar238 + fVar116 * fStack_4c8;
    auVar332._12_4_ = fVar256 * fVar114 + fVar117 * fStack_4c4;
    auVar297._0_4_ = fVar235 * local_500 + fVar257 * (float)local_4e0._0_4_;
    auVar297._4_4_ = fVar239 * fStack_4fc + fVar115 * (float)local_4e0._4_4_;
    auVar297._8_4_ = fVar255 * fStack_4f8 + fVar116 * fStack_4d8;
    auVar297._12_4_ = fVar256 * fStack_4f4 + fVar117 * fStack_4d4;
    auVar142 = vsubps_avx(auVar325,auVar309);
    auVar130 = vsubps_avx(auVar332,auVar325);
    auVar166 = vsubps_avx(auVar297,auVar332);
    local_110 = vshufps_avx(auVar16,auVar16,0);
    fVar235 = local_110._0_4_;
    fVar255 = local_110._4_4_;
    fVar256 = local_110._8_4_;
    fVar115 = local_110._12_4_;
    auVar94 = vshufps_avx(ZEXT416((uint)fVar241),ZEXT416((uint)fVar241),0);
    fVar239 = auVar94._0_4_;
    fVar241 = auVar94._4_4_;
    fVar257 = auVar94._8_4_;
    fVar116 = auVar94._12_4_;
    auVar94 = vshufps_avx(auVar252,auVar252,0);
    auVar290 = vshufps_avx(ZEXT416((uint)fVar237),ZEXT416((uint)fVar237),0);
    auVar180 = vshufps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),0);
    auVar232._0_4_ =
         ((auVar130._0_4_ * fVar239 + auVar166._0_4_ * fVar235) * fVar235 +
         (auVar142._0_4_ * fVar239 + auVar130._0_4_ * fVar235) * fVar239) * 3.0;
    auVar232._4_4_ =
         ((auVar130._4_4_ * fVar241 + auVar166._4_4_ * fVar255) * fVar255 +
         (auVar142._4_4_ * fVar241 + auVar130._4_4_ * fVar255) * fVar241) * 3.0;
    auVar232._8_4_ =
         ((auVar130._8_4_ * fVar257 + auVar166._8_4_ * fVar256) * fVar256 +
         (auVar142._8_4_ * fVar257 + auVar130._8_4_ * fVar256) * fVar257) * 3.0;
    auVar232._12_4_ =
         ((auVar130._12_4_ * fVar116 + auVar166._12_4_ * fVar115) * fVar115 +
         (auVar142._12_4_ * fVar116 + auVar130._12_4_ * fVar115) * fVar116) * 3.0;
    auVar142 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
    auVar145._0_4_ =
         auVar142._0_4_ * (float)local_440._0_4_ +
         auVar180._0_4_ * (float)local_450._0_4_ +
         auVar94._0_4_ * (float)local_470._0_4_ + auVar290._0_4_ * (float)local_460._0_4_;
    auVar145._4_4_ =
         auVar142._4_4_ * (float)local_440._4_4_ +
         auVar180._4_4_ * (float)local_450._4_4_ +
         auVar94._4_4_ * (float)local_470._4_4_ + auVar290._4_4_ * (float)local_460._4_4_;
    auVar145._8_4_ =
         auVar142._8_4_ * fStack_438 +
         auVar180._8_4_ * fStack_448 + auVar94._8_4_ * fStack_468 + auVar290._8_4_ * fStack_458;
    auVar145._12_4_ =
         auVar142._12_4_ * fStack_434 +
         auVar180._12_4_ * fStack_444 + auVar94._12_4_ * fStack_464 + auVar290._12_4_ * fStack_454;
    auVar94 = vshufps_avx(auVar232,auVar232,0xc9);
    auVar181._0_4_ = auVar145._0_4_ * auVar94._0_4_;
    auVar181._4_4_ = auVar145._4_4_ * auVar94._4_4_;
    auVar181._8_4_ = auVar145._8_4_ * auVar94._8_4_;
    auVar181._12_4_ = auVar145._12_4_ * auVar94._12_4_;
    auVar94 = vshufps_avx(auVar145,auVar145,0xc9);
    auVar146._0_4_ = auVar232._0_4_ * auVar94._0_4_;
    auVar146._4_4_ = auVar232._4_4_ * auVar94._4_4_;
    auVar146._8_4_ = auVar232._8_4_ * auVar94._8_4_;
    auVar146._12_4_ = auVar232._12_4_ * auVar94._12_4_;
    auVar94 = vsubps_avx(auVar146,auVar181);
    local_170 = vshufps_avx(auVar94,auVar94,0x55);
    local_180[0] = (RTCHitN)local_170[0];
    local_180[1] = (RTCHitN)local_170[1];
    local_180[2] = (RTCHitN)local_170[2];
    local_180[3] = (RTCHitN)local_170[3];
    local_180[4] = (RTCHitN)local_170[4];
    local_180[5] = (RTCHitN)local_170[5];
    local_180[6] = (RTCHitN)local_170[6];
    local_180[7] = (RTCHitN)local_170[7];
    local_180[8] = (RTCHitN)local_170[8];
    local_180[9] = (RTCHitN)local_170[9];
    local_180[10] = (RTCHitN)local_170[10];
    local_180[0xb] = (RTCHitN)local_170[0xb];
    local_180[0xc] = (RTCHitN)local_170[0xc];
    local_180[0xd] = (RTCHitN)local_170[0xd];
    local_180[0xe] = (RTCHitN)local_170[0xe];
    local_180[0xf] = (RTCHitN)local_170[0xf];
    local_150 = vshufps_avx(auVar94,auVar94,0xaa);
    local_160 = local_150;
    local_130 = vshufps_avx(auVar94,auVar94,0);
    local_140 = local_130;
    local_120 = local_110;
    local_100 = local_f0;
    local_e0 = local_320._0_8_;
    uStack_d8 = local_320._8_8_;
    uStack_d0 = local_320._16_8_;
    uStack_c8 = local_320._24_8_;
    local_c0 = local_300;
    vcmpps_avx(local_300,local_300,0xf);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar200;
    local_520 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar72 & 0xf) << 4));
    local_510 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar72 >> 4) * 0x10);
    local_4a0.valid = (int *)local_520;
    local_4a0.geometryUserPtr = pGVar9->userPtr;
    local_4a0.context = context->user;
    local_4a0.ray = (RTCRayN *)ray;
    local_4a0.hit = local_180;
    local_4a0.N = 8;
    if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar9->occlusionFilterN)(&local_4a0);
    }
    auVar94 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
    auVar290 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
    auVar184._16_16_ = auVar290;
    auVar184._0_16_ = auVar94;
    auVar106 = _DAT_01f7b020 & ~auVar184;
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar106 >> 0x7f,0) != '\0') ||
          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar106 >> 0xbf,0) != '\0') ||
        (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar106[0x1f] < '\0') {
      p_Var14 = context->args->filter;
      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var14)(&local_4a0);
      }
      auVar94 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
      auVar290 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
      auVar112._16_16_ = auVar290;
      auVar112._0_16_ = auVar94;
      auVar151._8_4_ = 0xff800000;
      auVar151._0_8_ = 0xff800000ff800000;
      auVar151._12_4_ = 0xff800000;
      auVar151._16_4_ = 0xff800000;
      auVar151._20_4_ = 0xff800000;
      auVar151._24_4_ = 0xff800000;
      auVar151._28_4_ = 0xff800000;
      auVar106 = vblendvps_avx(auVar151,*(undefined1 (*) [32])(local_4a0.ray + 0x100),auVar112);
      *(undefined1 (*) [32])(local_4a0.ray + 0x100) = auVar106;
      auVar106 = _DAT_01f7b020 & ~auVar112;
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0x7f,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar106 >> 0xbf,0) != '\0') ||
          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar106[0x1f] < '\0') {
        bVar71 = 1;
        goto LAB_008f16bf;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar202;
  }
  bVar71 = 0;
LAB_008f16bf:
  bVar75 = (bool)(bVar75 | bVar71);
  goto LAB_008f06d6;
LAB_008f16dc:
  auVar94 = vinsertps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar200),0x10);
  auVar367 = ZEXT1664(auVar94);
  auVar334 = ZEXT1664(auVar268);
  goto LAB_008f0067;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }